

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O2

void fdct64_avx2(__m256i *input,__m256i *output,int8_t cos_bit,int instride,int outstride)

{
  __m256i *palVar1;
  undefined4 uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  __m256i alVar29;
  __m256i alVar30;
  __m256i alVar31;
  __m256i alVar32;
  __m256i alVar33;
  __m256i alVar34;
  __m256i alVar35;
  __m256i alVar36;
  __m256i alVar37;
  __m256i alVar38;
  __m256i alVar39;
  __m256i alVar40;
  __m256i alVar41;
  __m256i alVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  uint uVar55;
  int iVar56;
  undefined7 in_register_00000011;
  int iVar57;
  long lVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  longlong local_878;
  longlong lStack_870;
  longlong lStack_868;
  longlong lStack_860;
  longlong local_858;
  longlong lStack_850;
  longlong lStack_848;
  longlong lStack_840;
  longlong local_838;
  longlong lStack_830;
  longlong lStack_828;
  longlong lStack_820;
  longlong local_818;
  longlong lStack_810;
  longlong lStack_808;
  longlong lStack_800;
  longlong local_7f8;
  longlong lStack_7f0;
  longlong lStack_7e8;
  longlong lStack_7e0;
  longlong local_758;
  longlong lStack_750;
  longlong lStack_748;
  longlong lStack_740;
  longlong local_6b8;
  longlong lStack_6b0;
  longlong lStack_6a8;
  longlong lStack_6a0;
  longlong local_698;
  longlong lStack_690;
  longlong lStack_688;
  longlong lStack_680;
  longlong local_678;
  longlong lStack_670;
  longlong lStack_668;
  longlong lStack_660;
  longlong local_658;
  longlong lStack_650;
  longlong lStack_648;
  longlong lStack_640;
  longlong local_638;
  longlong lStack_630;
  longlong lStack_628;
  longlong lStack_620;
  longlong local_598;
  longlong lStack_590;
  longlong lStack_588;
  longlong lStack_580;
  longlong local_578;
  longlong lStack_570;
  longlong lStack_568;
  longlong lStack_560;
  longlong local_558;
  longlong lStack_550;
  longlong lStack_548;
  longlong lStack_540;
  longlong local_538;
  longlong lStack_530;
  longlong lStack_528;
  longlong lStack_520;
  longlong local_518;
  longlong lStack_510;
  longlong lStack_508;
  longlong lStack_500;
  longlong local_4f8;
  longlong lStack_4f0;
  longlong lStack_4e8;
  longlong lStack_4e0;
  longlong local_4d8;
  longlong lStack_4d0;
  longlong lStack_4c8;
  longlong lStack_4c0;
  longlong local_4b8;
  longlong lStack_4b0;
  longlong lStack_4a8;
  longlong lStack_4a0;
  longlong local_498;
  longlong lStack_490;
  longlong lStack_488;
  longlong lStack_480;
  longlong local_478;
  longlong lStack_470;
  longlong lStack_468;
  longlong lStack_460;
  longlong local_458;
  longlong lStack_450;
  longlong lStack_448;
  longlong lStack_440;
  longlong local_438;
  longlong lStack_430;
  longlong lStack_428;
  longlong lStack_420;
  longlong local_418;
  longlong lStack_410;
  longlong lStack_408;
  longlong lStack_400;
  longlong local_3f8;
  longlong lStack_3f0;
  longlong lStack_3e8;
  longlong lStack_3e0;
  longlong local_3d8;
  longlong lStack_3d0;
  longlong lStack_3c8;
  longlong lStack_3c0;
  longlong local_3b8;
  longlong lStack_3b0;
  longlong lStack_3a8;
  longlong lStack_3a0;
  longlong local_398;
  longlong lStack_390;
  longlong lStack_388;
  longlong lStack_380;
  longlong local_378;
  longlong lStack_370;
  longlong lStack_368;
  longlong lStack_360;
  longlong local_358;
  longlong lStack_350;
  longlong lStack_348;
  longlong lStack_340;
  longlong local_338;
  longlong lStack_330;
  longlong lStack_328;
  longlong lStack_320;
  longlong local_318;
  longlong lStack_310;
  longlong lStack_308;
  longlong lStack_300;
  longlong local_2d8;
  longlong lStack_2d0;
  longlong lStack_2c8;
  longlong lStack_2c0;
  longlong local_2b8;
  longlong lStack_2b0;
  longlong lStack_2a8;
  longlong lStack_2a0;
  longlong local_298;
  longlong lStack_290;
  longlong lStack_288;
  longlong lStack_280;
  longlong local_278;
  longlong lStack_270;
  longlong lStack_268;
  longlong lStack_260;
  longlong local_258;
  longlong lStack_250;
  longlong lStack_248;
  longlong lStack_240;
  longlong local_238;
  longlong lStack_230;
  longlong lStack_228;
  longlong lStack_220;
  longlong local_218;
  longlong lStack_210;
  longlong lStack_208;
  longlong lStack_200;
  longlong local_1f8;
  longlong lStack_1f0;
  longlong lStack_1e8;
  longlong lStack_1e0;
  longlong local_1d8;
  longlong lStack_1d0;
  longlong lStack_1c8;
  longlong lStack_1c0;
  longlong local_1b8;
  longlong lStack_1b0;
  longlong lStack_1a8;
  longlong lStack_1a0;
  longlong local_198;
  longlong lStack_190;
  longlong lStack_188;
  longlong lStack_180;
  longlong local_178;
  longlong lStack_170;
  longlong lStack_168;
  longlong lStack_160;
  longlong local_158;
  longlong lStack_150;
  longlong lStack_148;
  longlong lStack_140;
  longlong local_138;
  longlong lStack_130;
  longlong lStack_128;
  longlong lStack_120;
  longlong local_118;
  longlong lStack_110;
  longlong lStack_108;
  longlong lStack_100;
  longlong local_f8;
  longlong lStack_f0;
  longlong lStack_e8;
  longlong lStack_e0;
  longlong local_d8;
  longlong lStack_d0;
  longlong lStack_c8;
  longlong lStack_c0;
  longlong local_b8;
  longlong lStack_b0;
  longlong lStack_a8;
  longlong lStack_a0;
  
  auVar3 = vpaddd_avx2((undefined1  [32])input[0x1f8],(undefined1  [32])*input);
  auVar43 = vpsubd_avx2((undefined1  [32])*input,(undefined1  [32])input[0x1f8]);
  auVar4 = vpaddd_avx2((undefined1  [32])input[0x1f0],(undefined1  [32])input[8]);
  auVar87 = vpsubd_avx2((undefined1  [32])input[8],(undefined1  [32])input[0x1f0]);
  auVar5 = vpaddd_avx2((undefined1  [32])input[0x1e8],(undefined1  [32])input[0x10]);
  auVar73 = vpsubd_avx2((undefined1  [32])input[0x10],(undefined1  [32])input[0x1e8]);
  auVar6 = vpaddd_avx2((undefined1  [32])input[0x1e0],(undefined1  [32])input[0x18]);
  auVar67 = vpsubd_avx2((undefined1  [32])input[0x18],(undefined1  [32])input[0x1e0]);
  auVar7 = vpaddd_avx2((undefined1  [32])input[0x1d8],(undefined1  [32])input[0x20]);
  auVar83 = vpsubd_avx2((undefined1  [32])input[0x20],(undefined1  [32])input[0x1d8]);
  auVar8 = vpaddd_avx2((undefined1  [32])input[0x1d0],(undefined1  [32])input[0x28]);
  auVar68 = vpsubd_avx2((undefined1  [32])input[0x28],(undefined1  [32])input[0x1d0]);
  auVar9 = vpaddd_avx2((undefined1  [32])input[0x1c8],(undefined1  [32])input[0x30]);
  auVar92 = vpsubd_avx2((undefined1  [32])input[0x30],(undefined1  [32])input[0x1c8]);
  auVar10 = vpaddd_avx2((undefined1  [32])input[0x1c0],(undefined1  [32])input[0x38]);
  auVar44 = vpsubd_avx2((undefined1  [32])input[0x38],(undefined1  [32])input[0x1c0]);
  auVar11 = vpaddd_avx2((undefined1  [32])input[0x1b8],(undefined1  [32])input[0x40]);
  auVar45 = vpsubd_avx2((undefined1  [32])input[0x40],(undefined1  [32])input[0x1b8]);
  auVar12 = vpaddd_avx2((undefined1  [32])input[0x1b0],(undefined1  [32])input[0x48]);
  auVar71 = vpsubd_avx2((undefined1  [32])input[0x48],(undefined1  [32])input[0x1b0]);
  auVar13 = vpaddd_avx2((undefined1  [32])input[0x1a8],(undefined1  [32])input[0x50]);
  auVar46 = vpsubd_avx2((undefined1  [32])input[0x50],(undefined1  [32])input[0x1a8]);
  auVar14 = vpaddd_avx2((undefined1  [32])input[0x1a0],(undefined1  [32])input[0x58]);
  auVar47 = vpsubd_avx2((undefined1  [32])input[0x58],(undefined1  [32])input[0x1a0]);
  auVar15 = vpaddd_avx2((undefined1  [32])input[0x198],(undefined1  [32])input[0x60]);
  auVar48 = vpsubd_avx2((undefined1  [32])input[0x60],(undefined1  [32])input[0x198]);
  auVar16 = vpaddd_avx2((undefined1  [32])input[400],(undefined1  [32])input[0x68]);
  auVar49 = vpsubd_avx2((undefined1  [32])input[0x68],(undefined1  [32])input[400]);
  auVar17 = vpaddd_avx2((undefined1  [32])input[0x188],(undefined1  [32])input[0x70]);
  auVar97 = vpsubd_avx2((undefined1  [32])input[0x70],(undefined1  [32])input[0x188]);
  auVar18 = vpaddd_avx2((undefined1  [32])input[0x180],(undefined1  [32])input[0x78]);
  auVar50 = vpsubd_avx2((undefined1  [32])input[0x78],(undefined1  [32])input[0x180]);
  auVar19 = vpaddd_avx2((undefined1  [32])input[0x178],(undefined1  [32])input[0x80]);
  auVar98 = vpsubd_avx2((undefined1  [32])input[0x80],(undefined1  [32])input[0x178]);
  auVar20 = vpaddd_avx2((undefined1  [32])input[0x170],(undefined1  [32])input[0x88]);
  auVar123 = vpsubd_avx2((undefined1  [32])input[0x88],(undefined1  [32])input[0x170]);
  auVar21 = vpaddd_avx2((undefined1  [32])input[0x168],(undefined1  [32])input[0x90]);
  auVar51 = vpsubd_avx2((undefined1  [32])input[0x90],(undefined1  [32])input[0x168]);
  auVar22 = vpaddd_avx2((undefined1  [32])input[0x160],(undefined1  [32])input[0x98]);
  auVar69 = vpsubd_avx2((undefined1  [32])input[0x98],(undefined1  [32])input[0x160]);
  auVar78 = vpaddd_avx2((undefined1  [32])input[0x158],(undefined1  [32])input[0xa0]);
  auVar52 = vpsubd_avx2((undefined1  [32])input[0xa0],(undefined1  [32])input[0x158]);
  auVar23 = vpaddd_avx2((undefined1  [32])input[0x150],(undefined1  [32])input[0xa8]);
  auVar99 = vpsubd_avx2((undefined1  [32])input[0xa8],(undefined1  [32])input[0x150]);
  auVar24 = vpaddd_avx2((undefined1  [32])input[0x148],(undefined1  [32])input[0xb0]);
  auVar53 = vpsubd_avx2((undefined1  [32])input[0xb0],(undefined1  [32])input[0x148]);
  auVar25 = vpaddd_avx2((undefined1  [32])input[0x140],(undefined1  [32])input[0xb8]);
  auVar102 = vpsubd_avx2((undefined1  [32])input[0xb8],(undefined1  [32])input[0x140]);
  auVar26 = vpaddd_avx2((undefined1  [32])input[0x138],(undefined1  [32])input[0xc0]);
  auVar93 = vpsubd_avx2((undefined1  [32])input[0xc0],(undefined1  [32])input[0x138]);
  auVar82 = vpaddd_avx2((undefined1  [32])input[0x130],(undefined1  [32])input[200]);
  auVar94 = vpsubd_avx2((undefined1  [32])input[200],(undefined1  [32])input[0x130]);
  auVar27 = vpaddd_avx2((undefined1  [32])input[0x128],(undefined1  [32])input[0xd0]);
  auVar72 = vpsubd_avx2((undefined1  [32])input[0xd0],(undefined1  [32])input[0x128]);
  auVar96 = vpaddd_avx2((undefined1  [32])input[0x120],(undefined1  [32])input[0xd8]);
  auVar75 = vpsubd_avx2((undefined1  [32])input[0xd8],(undefined1  [32])input[0x120]);
  auVar74 = vpaddd_avx2((undefined1  [32])input[0x118],(undefined1  [32])input[0xe0]);
  auVar124 = vpsubd_avx2((undefined1  [32])input[0xe0],(undefined1  [32])input[0x118]);
  auVar137 = vpaddd_avx2((undefined1  [32])input[0x110],(undefined1  [32])input[0xe8]);
  auVar88 = vpsubd_avx2((undefined1  [32])input[0xe8],(undefined1  [32])input[0x110]);
  auVar66 = vpaddd_avx2((undefined1  [32])input[0x108],(undefined1  [32])input[0xf0]);
  auVar89 = vpsubd_avx2((undefined1  [32])input[0xf0],(undefined1  [32])input[0x108]);
  auVar28 = vpaddd_avx2((undefined1  [32])input[0x100],(undefined1  [32])input[0xf8]);
  auVar79 = vpsubd_avx2((undefined1  [32])input[0xf8],(undefined1  [32])input[0x100]);
  auVar70 = vpaddd_avx2(auVar28,auVar3);
  auVar54 = vpsubd_avx2(auVar3,auVar28);
  auVar3 = vpaddd_avx2(auVar66,auVar4);
  auVar76 = vpsubd_avx2(auVar4,auVar66);
  auVar4 = vpaddd_avx2(auVar137,auVar5);
  auVar80 = vpsubd_avx2(auVar5,auVar137);
  auVar5 = vpaddd_avx2(auVar74,auVar6);
  auVar86 = vpsubd_avx2(auVar6,auVar74);
  auVar6 = vpaddd_avx2(auVar96,auVar7);
  auVar77 = vpsubd_avx2(auVar7,auVar96);
  auVar7 = vpaddd_avx2(auVar27,auVar8);
  auVar81 = vpsubd_avx2(auVar8,auVar27);
  auVar8 = vpaddd_avx2(auVar82,auVar9);
  auVar84 = vpsubd_avx2(auVar9,auVar82);
  auVar9 = vpaddd_avx2(auVar26,auVar10);
  auVar90 = vpsubd_avx2(auVar10,auVar26);
  auVar10 = vpaddd_avx2(auVar25,auVar11);
  auVar91 = vpsubd_avx2(auVar11,auVar25);
  auVar11 = vpaddd_avx2(auVar24,auVar12);
  auVar95 = vpsubd_avx2(auVar12,auVar24);
  auVar12 = vpaddd_avx2(auVar23,auVar13);
  auVar100 = vpsubd_avx2(auVar13,auVar23);
  auVar13 = vpaddd_avx2(auVar78,auVar14);
  auVar101 = vpsubd_avx2(auVar14,auVar78);
  auVar14 = vpaddd_avx2(auVar22,auVar15);
  auVar103 = vpsubd_avx2(auVar15,auVar22);
  auVar15 = vpaddd_avx2(auVar21,auVar16);
  auVar104 = vpsubd_avx2(auVar16,auVar21);
  auVar16 = vpaddd_avx2(auVar20,auVar17);
  auVar105 = vpsubd_avx2(auVar17,auVar20);
  auVar17 = vpaddd_avx2(auVar19,auVar18);
  auVar106 = vpsubd_avx2(auVar18,auVar19);
  uVar55 = (uint)CONCAT71(in_register_00000011,cos_bit);
  lVar58 = (long)(int)uVar55 * 0x100;
  iVar56 = 1 << (cos_bit - 1U & 0x1f);
  auVar85._4_4_ = iVar56;
  auVar85._0_4_ = iVar56;
  auVar85._8_4_ = iVar56;
  auVar85._12_4_ = iVar56;
  auVar85._16_4_ = iVar56;
  auVar85._20_4_ = iVar56;
  auVar85._24_4_ = iVar56;
  auVar85._28_4_ = iVar56;
  iVar56 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x1e0);
  iVar59 = -iVar56;
  auVar139._4_4_ = iVar59;
  auVar139._0_4_ = iVar59;
  auVar139._8_4_ = iVar59;
  auVar139._12_4_ = iVar59;
  auVar139._16_4_ = iVar59;
  auVar139._20_4_ = iVar59;
  auVar139._24_4_ = iVar59;
  auVar139._28_4_ = iVar59;
  auVar141._4_4_ = iVar56;
  auVar141._0_4_ = iVar56;
  auVar141._8_4_ = iVar56;
  auVar141._12_4_ = iVar56;
  auVar141._16_4_ = iVar56;
  auVar141._20_4_ = iVar56;
  auVar141._24_4_ = iVar56;
  auVar141._28_4_ = iVar56;
  auVar18 = vpmulld_avx2(auVar45,auVar141);
  auVar18 = vpaddd_avx2(auVar18,auVar85);
  auVar19 = vpmulld_avx2(auVar102,auVar139);
  auVar18 = vpaddd_avx2(auVar19,auVar18);
  auVar19 = vpmulld_avx2(auVar102,auVar141);
  auVar20 = vpmulld_avx2(auVar139,auVar45);
  auVar20 = vpsubd_avx2(auVar85,auVar20);
  auVar19 = vpaddd_avx2(auVar20,auVar19);
  auVar20 = vpmulld_avx2(auVar71,auVar141);
  auVar20 = vpaddd_avx2(auVar20,auVar85);
  auVar21 = vpmulld_avx2(auVar53,auVar139);
  auVar20 = vpaddd_avx2(auVar21,auVar20);
  auVar21 = vpmulld_avx2(auVar53,auVar141);
  auVar22 = vpmulld_avx2(auVar139,auVar71);
  auVar22 = vpsubd_avx2(auVar85,auVar22);
  auVar21 = vpaddd_avx2(auVar22,auVar21);
  auVar22 = vpmulld_avx2(auVar46,auVar141);
  auVar22 = vpaddd_avx2(auVar22,auVar85);
  auVar78 = vpmulld_avx2(auVar99,auVar139);
  auVar22 = vpaddd_avx2(auVar78,auVar22);
  auVar78 = vpmulld_avx2(auVar99,auVar141);
  auVar23 = vpmulld_avx2(auVar139,auVar46);
  auVar23 = vpsubd_avx2(auVar85,auVar23);
  auVar78 = vpaddd_avx2(auVar23,auVar78);
  auVar23 = vpmulld_avx2(auVar47,auVar141);
  auVar23 = vpaddd_avx2(auVar23,auVar85);
  auVar24 = vpmulld_avx2(auVar52,auVar139);
  auVar23 = vpaddd_avx2(auVar24,auVar23);
  auVar24 = vpmulld_avx2(auVar52,auVar141);
  auVar25 = vpmulld_avx2(auVar139,auVar47);
  auVar25 = vpsubd_avx2(auVar85,auVar25);
  auVar24 = vpaddd_avx2(auVar25,auVar24);
  auVar25 = vpmulld_avx2(auVar48,auVar141);
  auVar25 = vpaddd_avx2(auVar25,auVar85);
  auVar26 = vpmulld_avx2(auVar69,auVar139);
  auVar25 = vpaddd_avx2(auVar26,auVar25);
  auVar26 = vpmulld_avx2(auVar69,auVar141);
  auVar82 = vpmulld_avx2(auVar139,auVar48);
  auVar82 = vpsubd_avx2(auVar85,auVar82);
  auVar26 = vpaddd_avx2(auVar82,auVar26);
  auVar82 = vpmulld_avx2(auVar49,auVar141);
  auVar82 = vpaddd_avx2(auVar82,auVar85);
  auVar27 = vpmulld_avx2(auVar51,auVar139);
  auVar82 = vpaddd_avx2(auVar27,auVar82);
  auVar27 = vpmulld_avx2(auVar51,auVar141);
  auVar96 = vpmulld_avx2(auVar139,auVar49);
  auVar96 = vpsubd_avx2(auVar85,auVar96);
  auVar27 = vpaddd_avx2(auVar96,auVar27);
  auVar96 = vpmulld_avx2(auVar97,auVar141);
  auVar96 = vpaddd_avx2(auVar96,auVar85);
  auVar74 = vpmulld_avx2(auVar123,auVar139);
  auVar96 = vpaddd_avx2(auVar74,auVar96);
  auVar74 = vpmulld_avx2(auVar123,auVar141);
  auVar137 = vpmulld_avx2(auVar139,auVar97);
  auVar137 = vpsubd_avx2(auVar85,auVar137);
  auVar74 = vpaddd_avx2(auVar137,auVar74);
  auVar137 = vpmulld_avx2(auVar50,auVar141);
  auVar137 = vpaddd_avx2(auVar137,auVar85);
  auVar66 = vpmulld_avx2(auVar98,auVar139);
  auVar137 = vpaddd_avx2(auVar66,auVar137);
  auVar66 = vpmulld_avx2(auVar98,auVar141);
  auVar28 = vpmulld_avx2(auVar139,auVar50);
  auVar28 = vpsubd_avx2(auVar85,auVar28);
  auVar66 = vpaddd_avx2(auVar28,auVar66);
  auVar28 = vpaddd_avx2(auVar70,auVar17);
  auVar45 = vpsubd_avx2(auVar70,auVar17);
  auVar17 = vpaddd_avx2(auVar3,auVar16);
  auVar71 = vpsubd_avx2(auVar3,auVar16);
  auVar3 = vpaddd_avx2(auVar4,auVar15);
  auVar46 = vpsubd_avx2(auVar4,auVar15);
  auVar4 = vpaddd_avx2(auVar5,auVar14);
  auVar47 = vpsubd_avx2(auVar5,auVar14);
  auVar5 = vpaddd_avx2(auVar6,auVar13);
  auVar48 = vpsubd_avx2(auVar6,auVar13);
  auVar6 = vpaddd_avx2(auVar7,auVar12);
  auVar49 = vpsubd_avx2(auVar7,auVar12);
  auVar7 = vpaddd_avx2(auVar8,auVar11);
  auVar97 = vpsubd_avx2(auVar8,auVar11);
  auVar70 = vpsrad_avx2(auVar18,ZEXT416(uVar55));
  auVar8 = vpaddd_avx2(auVar9,auVar10);
  auVar50 = vpsubd_avx2(auVar9,auVar10);
  auVar9 = vpmulld_avx2(auVar77,auVar141);
  auVar9 = vpaddd_avx2(auVar85,auVar9);
  auVar10 = vpmulld_avx2(auVar101,auVar139);
  auVar9 = vpaddd_avx2(auVar10,auVar9);
  auVar10 = vpmulld_avx2(auVar101,auVar141);
  auVar11 = vpmulld_avx2(auVar139,auVar77);
  auVar10 = vpaddd_avx2(auVar10,auVar85);
  auVar98 = vpsubd_avx2(auVar10,auVar11);
  auVar10 = vpmulld_avx2(auVar81,auVar141);
  auVar10 = vpaddd_avx2(auVar85,auVar10);
  auVar11 = vpmulld_avx2(auVar100,auVar139);
  auVar10 = vpaddd_avx2(auVar11,auVar10);
  auVar11 = vpmulld_avx2(auVar100,auVar141);
  auVar12 = vpmulld_avx2(auVar139,auVar81);
  auVar11 = vpaddd_avx2(auVar11,auVar85);
  auVar123 = vpsubd_avx2(auVar11,auVar12);
  auVar11 = vpmulld_avx2(auVar84,auVar141);
  auVar11 = vpaddd_avx2(auVar85,auVar11);
  auVar12 = vpmulld_avx2(auVar95,auVar139);
  auVar11 = vpaddd_avx2(auVar12,auVar11);
  auVar12 = vpmulld_avx2(auVar95,auVar141);
  auVar13 = vpmulld_avx2(auVar139,auVar84);
  auVar12 = vpaddd_avx2(auVar12,auVar85);
  auVar51 = vpsubd_avx2(auVar12,auVar13);
  auVar12 = vpmulld_avx2(auVar90,auVar141);
  auVar12 = vpaddd_avx2(auVar85,auVar12);
  auVar13 = vpmulld_avx2(auVar91,auVar139);
  auVar12 = vpaddd_avx2(auVar13,auVar12);
  auVar13 = vpmulld_avx2(auVar91,auVar141);
  auVar14 = vpmulld_avx2(auVar139,auVar90);
  auVar13 = vpaddd_avx2(auVar13,auVar85);
  auVar69 = vpsubd_avx2(auVar13,auVar14);
  auVar14 = vpsrad_avx2(auVar137,ZEXT416(uVar55));
  auVar13 = vpaddd_avx2(auVar79,auVar14);
  auVar52 = vpsubd_avx2(auVar79,auVar14);
  auVar65 = ZEXT416(uVar55);
  auVar15 = vpsrad_avx2(auVar96,auVar65);
  auVar14 = vpaddd_avx2(auVar89,auVar15);
  auVar99 = vpsubd_avx2(auVar89,auVar15);
  auVar16 = vpsrad_avx2(auVar82,auVar65);
  auVar15 = vpaddd_avx2(auVar88,auVar16);
  auVar53 = vpsubd_avx2(auVar88,auVar16);
  auVar18 = vpsrad_avx2(auVar25,auVar65);
  auVar16 = vpaddd_avx2(auVar124,auVar18);
  auVar102 = vpsubd_avx2(auVar124,auVar18);
  auVar23 = vpsrad_avx2(auVar23,auVar65);
  auVar18 = vpaddd_avx2(auVar23,auVar75);
  auVar75 = vpsubd_avx2(auVar75,auVar23);
  auVar65 = ZEXT416(uVar55);
  auVar23 = vpsrad_avx2(auVar22,auVar65);
  auVar22 = vpaddd_avx2(auVar23,auVar72);
  auVar72 = vpsubd_avx2(auVar72,auVar23);
  auVar23 = vpsrad_avx2(auVar20,auVar65);
  auVar20 = vpaddd_avx2(auVar23,auVar94);
  auVar94 = vpsubd_avx2(auVar94,auVar23);
  auVar96 = vpsrad_avx2(auVar19,auVar65);
  auVar19 = vpaddd_avx2(auVar70,auVar93);
  auVar70 = vpsubd_avx2(auVar93,auVar70);
  auVar23 = vpsrad_avx2(auVar66,auVar65);
  auVar93 = vpsubd_avx2(auVar43,auVar23);
  auVar23 = vpaddd_avx2(auVar23,auVar43);
  auVar25 = vpsrad_avx2(auVar74,auVar65);
  auVar43 = vpsubd_avx2(auVar87,auVar25);
  auVar25 = vpaddd_avx2(auVar25,auVar87);
  auVar82 = vpsrad_avx2(auVar27,auVar65);
  auVar87 = vpsubd_avx2(auVar73,auVar82);
  auVar82 = vpaddd_avx2(auVar82,auVar73);
  auVar26 = vpsrad_avx2(auVar26,auVar65);
  auVar73 = vpsubd_avx2(auVar67,auVar26);
  auVar26 = vpaddd_avx2(auVar26,auVar67);
  auVar24 = vpsrad_avx2(auVar24,auVar65);
  auVar67 = vpsubd_avx2(auVar83,auVar24);
  auVar24 = vpaddd_avx2(auVar24,auVar83);
  auVar65 = ZEXT416(uVar55);
  auVar78 = vpsrad_avx2(auVar78,auVar65);
  auVar83 = vpsubd_avx2(auVar68,auVar78);
  auVar78 = vpaddd_avx2(auVar68,auVar78);
  auVar21 = vpsrad_avx2(auVar21,auVar65);
  auVar68 = vpsubd_avx2(auVar92,auVar21);
  auVar21 = vpaddd_avx2(auVar21,auVar92);
  auVar92 = vpsubd_avx2(auVar44,auVar96);
  auVar27 = vpaddd_avx2(auVar96,auVar44);
  auVar96 = vpaddd_avx2(auVar28,auVar8);
  auVar124 = vpsubd_avx2(auVar28,auVar8);
  auVar8 = vpaddd_avx2(auVar17,auVar7);
  auVar44 = vpsubd_avx2(auVar17,auVar7);
  auVar7 = vpaddd_avx2(auVar6,auVar3);
  auVar88 = vpsubd_avx2(auVar3,auVar6);
  auVar17 = vpsrad_avx2(auVar9,auVar65);
  auVar3 = vpaddd_avx2(auVar5,auVar4);
  auVar89 = vpsubd_avx2(auVar4,auVar5);
  auVar4 = vpmulld_avx2(auVar46,auVar141);
  auVar4 = vpaddd_avx2(auVar85,auVar4);
  auVar5 = vpmulld_avx2(auVar49,auVar139);
  auVar4 = vpaddd_avx2(auVar5,auVar4);
  auVar5 = vpmulld_avx2(auVar49,auVar141);
  auVar6 = vpmulld_avx2(auVar139,auVar46);
  auVar5 = vpaddd_avx2(auVar5,auVar85);
  auVar46 = vpsubd_avx2(auVar5,auVar6);
  auVar5 = vpmulld_avx2(auVar47,auVar141);
  auVar5 = vpaddd_avx2(auVar85,auVar5);
  auVar6 = vpmulld_avx2(auVar48,auVar139);
  auVar5 = vpaddd_avx2(auVar6,auVar5);
  auVar6 = vpmulld_avx2(auVar48,auVar141);
  auVar9 = vpmulld_avx2(auVar139,auVar47);
  auVar6 = vpaddd_avx2(auVar6,auVar85);
  auVar47 = vpsubd_avx2(auVar6,auVar9);
  auVar9 = vpsrad_avx2(auVar12,auVar65);
  auVar6 = vpaddd_avx2(auVar9,auVar106);
  auVar48 = vpsubd_avx2(auVar106,auVar9);
  auVar11 = vpsrad_avx2(auVar11,auVar65);
  auVar9 = vpaddd_avx2(auVar11,auVar105);
  auVar49 = vpsubd_avx2(auVar105,auVar11);
  auVar11 = vpsrad_avx2(auVar10,auVar65);
  auVar10 = vpaddd_avx2(auVar11,auVar104);
  auVar79 = vpsubd_avx2(auVar104,auVar11);
  auVar137 = vpsrad_avx2(auVar98,auVar65);
  auVar11 = vpaddd_avx2(auVar17,auVar103);
  auVar98 = vpsubd_avx2(auVar103,auVar17);
  auVar12 = vpsrad_avx2(auVar69,auVar65);
  auVar69 = vpsubd_avx2(auVar54,auVar12);
  auVar12 = vpaddd_avx2(auVar12,auVar54);
  auVar17 = vpsrad_avx2(auVar51,auVar65);
  auVar51 = vpsubd_avx2(auVar76,auVar17);
  auVar17 = vpaddd_avx2(auVar17,auVar76);
  auVar74 = vpsrad_avx2(auVar123,auVar65);
  auVar123 = vpsubd_avx2(auVar80,auVar74);
  auVar74 = vpaddd_avx2(auVar74,auVar80);
  auVar54 = vpsubd_avx2(auVar86,auVar137);
  auVar137 = vpaddd_avx2(auVar137,auVar86);
  iVar56 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x1a0);
  iVar59 = -iVar56;
  auVar120._4_4_ = iVar59;
  auVar120._0_4_ = iVar59;
  auVar120._8_4_ = iVar59;
  auVar120._12_4_ = iVar59;
  auVar120._16_4_ = iVar59;
  auVar120._20_4_ = iVar59;
  auVar120._24_4_ = iVar59;
  auVar120._28_4_ = iVar59;
  iVar59 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x220);
  auVar134._4_4_ = iVar59;
  auVar134._0_4_ = iVar59;
  auVar134._8_4_ = iVar59;
  auVar134._12_4_ = iVar59;
  auVar134._16_4_ = iVar59;
  auVar134._20_4_ = iVar59;
  auVar134._24_4_ = iVar59;
  auVar134._28_4_ = iVar59;
  auVar66 = vpmulld_avx2(auVar18,auVar120);
  auVar66 = vpaddd_avx2(auVar66,auVar85);
  auVar28 = vpmulld_avx2(auVar24,auVar134);
  auVar66 = vpaddd_avx2(auVar66,auVar28);
  auVar18 = vpmulld_avx2(auVar18,auVar134);
  auVar24 = vpmulld_avx2(auVar120,auVar24);
  auVar18 = vpaddd_avx2(auVar18,auVar85);
  auVar76 = vpsubd_avx2(auVar18,auVar24);
  auVar18 = vpmulld_avx2(auVar22,auVar120);
  auVar18 = vpaddd_avx2(auVar18,auVar85);
  auVar24 = vpmulld_avx2(auVar78,auVar134);
  auVar18 = vpaddd_avx2(auVar24,auVar18);
  auVar22 = vpmulld_avx2(auVar22,auVar134);
  auVar78 = vpmulld_avx2(auVar120,auVar78);
  auVar22 = vpaddd_avx2(auVar22,auVar85);
  auVar80 = vpsubd_avx2(auVar22,auVar78);
  auVar22 = vpmulld_avx2(auVar20,auVar120);
  auVar22 = vpaddd_avx2(auVar22,auVar85);
  auVar78 = vpmulld_avx2(auVar21,auVar134);
  auVar22 = vpaddd_avx2(auVar22,auVar78);
  auVar20 = vpmulld_avx2(auVar20,auVar134);
  auVar21 = vpmulld_avx2(auVar120,auVar21);
  auVar20 = vpaddd_avx2(auVar20,auVar85);
  auVar86 = vpsubd_avx2(auVar20,auVar21);
  auVar20 = vpmulld_avx2(auVar19,auVar120);
  auVar20 = vpaddd_avx2(auVar20,auVar85);
  auVar21 = vpmulld_avx2(auVar27,auVar134);
  auVar20 = vpaddd_avx2(auVar20,auVar21);
  auVar19 = vpmulld_avx2(auVar19,auVar134);
  auVar21 = vpmulld_avx2(auVar120,auVar27);
  auVar19 = vpaddd_avx2(auVar19,auVar85);
  auVar77 = vpsubd_avx2(auVar19,auVar21);
  iVar59 = -iVar59;
  auVar100._4_4_ = iVar59;
  auVar100._0_4_ = iVar59;
  auVar100._8_4_ = iVar59;
  auVar100._12_4_ = iVar59;
  auVar100._16_4_ = iVar59;
  auVar100._20_4_ = iVar59;
  auVar100._24_4_ = iVar59;
  auVar100._28_4_ = iVar59;
  auVar19 = vpmulld_avx2(auVar70,auVar100);
  auVar19 = vpaddd_avx2(auVar19,auVar85);
  auVar21 = vpmulld_avx2(auVar92,auVar120);
  auVar19 = vpaddd_avx2(auVar21,auVar19);
  auVar21 = vpmulld_avx2(auVar70,auVar120);
  auVar78 = vpmulld_avx2(auVar100,auVar92);
  auVar21 = vpaddd_avx2(auVar21,auVar85);
  auVar92 = vpsubd_avx2(auVar21,auVar78);
  auVar21 = vpmulld_avx2(auVar94,auVar100);
  auVar21 = vpaddd_avx2(auVar21,auVar85);
  auVar78 = vpmulld_avx2(auVar68,auVar120);
  auVar21 = vpaddd_avx2(auVar78,auVar21);
  auVar78 = vpmulld_avx2(auVar94,auVar120);
  auVar24 = vpmulld_avx2(auVar100,auVar68);
  auVar78 = vpaddd_avx2(auVar78,auVar85);
  auVar68 = vpsubd_avx2(auVar78,auVar24);
  auVar78 = vpmulld_avx2(auVar72,auVar100);
  auVar78 = vpaddd_avx2(auVar78,auVar85);
  auVar24 = vpmulld_avx2(auVar83,auVar120);
  auVar78 = vpaddd_avx2(auVar24,auVar78);
  auVar24 = vpmulld_avx2(auVar72,auVar120);
  auVar27 = vpmulld_avx2(auVar100,auVar83);
  auVar24 = vpaddd_avx2(auVar24,auVar85);
  auVar83 = vpsubd_avx2(auVar24,auVar27);
  auVar24 = vpmulld_avx2(auVar75,auVar100);
  auVar24 = vpaddd_avx2(auVar24,auVar85);
  auVar27 = vpmulld_avx2(auVar67,auVar120);
  auVar24 = vpaddd_avx2(auVar27,auVar24);
  auVar27 = vpmulld_avx2(auVar75,auVar120);
  auVar28 = vpmulld_avx2(auVar100,auVar67);
  auVar27 = vpaddd_avx2(auVar27,auVar85);
  auVar67 = vpsubd_avx2(auVar27,auVar28);
  auVar27 = vpaddd_avx2(auVar96,auVar3);
  auVar94 = vpsubd_avx2(auVar96,auVar3);
  auVar3 = vpaddd_avx2(auVar8,auVar7);
  auVar72 = vpsubd_avx2(auVar8,auVar7);
  auVar7 = vpmulld_avx2(auVar44,auVar141);
  auVar7 = vpaddd_avx2(auVar7,auVar85);
  auVar8 = vpmulld_avx2(auVar88,auVar139);
  auVar7 = vpaddd_avx2(auVar8,auVar7);
  auVar96 = vpmulld_avx2(auVar139,auVar44);
  auVar8 = vpmulld_avx2(auVar88,auVar141);
  auVar8 = vpaddd_avx2(auVar8,auVar85);
  auVar75 = vpsubd_avx2(auVar8,auVar96);
  auVar8 = vpsrad_avx2(auVar5,auVar65);
  auVar5 = vpaddd_avx2(auVar50,auVar8);
  auVar50 = vpsubd_avx2(auVar50,auVar8);
  auVar8 = vpsrad_avx2(auVar4,auVar65);
  auVar4 = vpaddd_avx2(auVar97,auVar8);
  auVar97 = vpsubd_avx2(auVar97,auVar8);
  auVar8 = vpsrad_avx2(auVar47,auVar65);
  auVar47 = vpsubd_avx2(auVar45,auVar8);
  auVar8 = vpaddd_avx2(auVar45,auVar8);
  auVar96 = vpsrad_avx2(auVar46,auVar65);
  auVar46 = vpsubd_avx2(auVar71,auVar96);
  auVar96 = vpaddd_avx2(auVar71,auVar96);
  auVar28 = vpmulld_avx2(auVar10,auVar120);
  auVar28 = vpaddd_avx2(auVar28,auVar85);
  auVar70 = vpmulld_avx2(auVar74,auVar134);
  auVar28 = vpaddd_avx2(auVar28,auVar70);
  auVar10 = vpmulld_avx2(auVar10,auVar134);
  auVar74 = vpmulld_avx2(auVar120,auVar74);
  auVar10 = vpaddd_avx2(auVar10,auVar85);
  auVar71 = vpsubd_avx2(auVar10,auVar74);
  auVar10 = vpmulld_avx2(auVar11,auVar120);
  auVar10 = vpaddd_avx2(auVar10,auVar85);
  auVar74 = vpmulld_avx2(auVar137,auVar134);
  auVar10 = vpaddd_avx2(auVar10,auVar74);
  auVar11 = vpmulld_avx2(auVar11,auVar134);
  auVar74 = vpmulld_avx2(auVar120,auVar137);
  auVar11 = vpaddd_avx2(auVar11,auVar85);
  auVar88 = vpsubd_avx2(auVar11,auVar74);
  auVar11 = vpmulld_avx2(auVar98,auVar100);
  auVar11 = vpaddd_avx2(auVar11,auVar85);
  auVar74 = vpmulld_avx2(auVar54,auVar120);
  auVar11 = vpaddd_avx2(auVar11,auVar74);
  auVar74 = vpmulld_avx2(auVar98,auVar120);
  auVar137 = vpmulld_avx2(auVar100,auVar54);
  auVar74 = vpaddd_avx2(auVar74,auVar85);
  auVar98 = vpsubd_avx2(auVar74,auVar137);
  auVar74 = vpmulld_avx2(auVar79,auVar100);
  auVar74 = vpaddd_avx2(auVar74,auVar85);
  auVar137 = vpmulld_avx2(auVar123,auVar120);
  auVar74 = vpaddd_avx2(auVar74,auVar137);
  auVar137 = vpmulld_avx2(auVar79,auVar120);
  auVar70 = vpmulld_avx2(auVar100,auVar123);
  auVar137 = vpaddd_avx2(auVar137,auVar85);
  auVar123 = vpsubd_avx2(auVar137,auVar70);
  auVar137 = vpsrad_avx2(auVar20,auVar65);
  auVar20 = vpaddd_avx2(auVar137,auVar13);
  auVar79 = vpsubd_avx2(auVar13,auVar137);
  auVar22 = vpsrad_avx2(auVar22,auVar65);
  auVar13 = vpaddd_avx2(auVar22,auVar14);
  auVar54 = vpsubd_avx2(auVar14,auVar22);
  auVar65 = ZEXT416(uVar55);
  auVar18 = vpsrad_avx2(auVar18,auVar65);
  auVar14 = vpaddd_avx2(auVar18,auVar15);
  auVar81 = vpsubd_avx2(auVar15,auVar18);
  auVar18 = vpsrad_avx2(auVar66,auVar65);
  auVar15 = vpaddd_avx2(auVar18,auVar16);
  auVar84 = vpsubd_avx2(auVar16,auVar18);
  auVar16 = vpsrad_avx2(auVar19,auVar65);
  auVar90 = vpsubd_avx2(auVar52,auVar16);
  auVar16 = vpaddd_avx2(auVar16,auVar52);
  auVar18 = vpsrad_avx2(auVar21,auVar65);
  auVar52 = vpsubd_avx2(auVar99,auVar18);
  auVar18 = vpaddd_avx2(auVar18,auVar99);
  auVar19 = vpsrad_avx2(auVar78,auVar65);
  auVar99 = vpsubd_avx2(auVar53,auVar19);
  auVar19 = vpaddd_avx2(auVar19,auVar53);
  auVar21 = vpsrad_avx2(auVar24,auVar65);
  auVar53 = vpsubd_avx2(auVar102,auVar21);
  auVar21 = vpaddd_avx2(auVar21,auVar102);
  auVar78 = vpsrad_avx2(auVar92,auVar65);
  auVar22 = vpaddd_avx2(auVar78,auVar93);
  auVar92 = vpsubd_avx2(auVar93,auVar78);
  auVar24 = vpsrad_avx2(auVar68,auVar65);
  auVar78 = vpaddd_avx2(auVar24,auVar43);
  auVar68 = vpsubd_avx2(auVar43,auVar24);
  auVar137 = vpsrad_avx2(auVar83,auVar65);
  auVar24 = vpaddd_avx2(auVar137,auVar87);
  auVar87 = vpsubd_avx2(auVar87,auVar137);
  auVar66 = vpsrad_avx2(auVar67,auVar65);
  auVar137 = vpaddd_avx2(auVar66,auVar73);
  auVar73 = vpsubd_avx2(auVar73,auVar66);
  auVar66 = vpsrad_avx2(auVar77,auVar65);
  auVar83 = vpsubd_avx2(auVar23,auVar66);
  auVar23 = vpaddd_avx2(auVar23,auVar66);
  auVar66 = vpsrad_avx2(auVar86,auVar65);
  auVar102 = vpsubd_avx2(auVar25,auVar66);
  auVar25 = vpaddd_avx2(auVar25,auVar66);
  auVar66 = vpsrad_avx2(auVar80,auVar65);
  auVar67 = vpsubd_avx2(auVar82,auVar66);
  auVar82 = vpaddd_avx2(auVar66,auVar82);
  auVar66 = vpsrad_avx2(auVar76,auVar65);
  auVar93 = vpsubd_avx2(auVar26,auVar66);
  auVar26 = vpaddd_avx2(auVar66,auVar26);
  auVar66 = vpaddd_avx2(auVar27,auVar3);
  auVar3 = vpsubd_avx2(auVar27,auVar3);
  auVar44 = vpmulld_avx2(auVar66,auVar141);
  auVar45 = vpmulld_avx2(auVar3,auVar141);
  auVar66._4_4_ = iVar56;
  auVar66._0_4_ = iVar56;
  auVar66._8_4_ = iVar56;
  auVar66._12_4_ = iVar56;
  auVar66._16_4_ = iVar56;
  auVar66._20_4_ = iVar56;
  auVar66._24_4_ = iVar56;
  auVar66._28_4_ = iVar56;
  auVar3 = vpmulld_avx2(auVar72,auVar134);
  auVar3 = vpaddd_avx2(auVar3,auVar85);
  auVar27 = vpmulld_avx2(auVar94,auVar66);
  auVar3 = vpaddd_avx2(auVar3,auVar27);
  auVar27 = vpmulld_avx2(auVar66,auVar72);
  auVar66 = vpmulld_avx2(auVar94,auVar134);
  auVar27 = vpsubd_avx2(auVar85,auVar27);
  auVar27 = vpaddd_avx2(auVar66,auVar27);
  auVar66 = vpsrad_avx2(auVar7,auVar65);
  auVar7 = vpaddd_avx2(auVar89,auVar66);
  auVar94 = vpsubd_avx2(auVar89,auVar66);
  auVar66 = vpsrad_avx2(auVar75,auVar65);
  auVar72 = vpsubd_avx2(auVar124,auVar66);
  auVar66 = vpaddd_avx2(auVar124,auVar66);
  auVar70 = vpmulld_avx2(auVar4,auVar120);
  auVar70 = vpaddd_avx2(auVar70,auVar85);
  auVar43 = vpmulld_avx2(auVar96,auVar134);
  auVar70 = vpaddd_avx2(auVar43,auVar70);
  auVar4 = vpmulld_avx2(auVar4,auVar134);
  auVar96 = vpmulld_avx2(auVar120,auVar96);
  auVar4 = vpaddd_avx2(auVar4,auVar85);
  auVar75 = vpsubd_avx2(auVar4,auVar96);
  auVar4 = vpmulld_avx2(auVar97,auVar100);
  auVar4 = vpaddd_avx2(auVar4,auVar85);
  auVar96 = vpmulld_avx2(auVar46,auVar120);
  auVar4 = vpaddd_avx2(auVar4,auVar96);
  auVar96 = vpmulld_avx2(auVar97,auVar120);
  auVar43 = vpmulld_avx2(auVar100,auVar46);
  auVar96 = vpaddd_avx2(auVar96,auVar85);
  auVar46 = vpsubd_avx2(auVar96,auVar43);
  auVar96 = vpsrad_avx2(auVar10,auVar65);
  auVar10 = vpaddd_avx2(auVar96,auVar6);
  auVar97 = vpsubd_avx2(auVar6,auVar96);
  auVar96 = vpsrad_avx2(auVar28,auVar65);
  auVar6 = vpaddd_avx2(auVar96,auVar9);
  auVar124 = vpsubd_avx2(auVar9,auVar96);
  auVar9 = vpsrad_avx2(auVar11,auVar65);
  auVar89 = vpsubd_avx2(auVar48,auVar9);
  auVar9 = vpaddd_avx2(auVar9,auVar48);
  auVar11 = vpsrad_avx2(auVar74,auVar65);
  auVar48 = vpsubd_avx2(auVar49,auVar11);
  auVar11 = vpaddd_avx2(auVar11,auVar49);
  auVar74 = vpsrad_avx2(auVar98,auVar65);
  auVar96 = vpaddd_avx2(auVar74,auVar69);
  auVar49 = vpsubd_avx2(auVar69,auVar74);
  auVar28 = vpsrad_avx2(auVar123,auVar65);
  auVar74 = vpaddd_avx2(auVar28,auVar51);
  auVar98 = vpsubd_avx2(auVar51,auVar28);
  auVar28 = vpsrad_avx2(auVar88,auVar65);
  auVar123 = vpsubd_avx2(auVar12,auVar28);
  auVar12 = vpaddd_avx2(auVar28,auVar12);
  auVar28 = vpsrad_avx2(auVar71,auVar65);
  auVar71 = vpsubd_avx2(auVar17,auVar28);
  auVar17 = vpaddd_avx2(auVar28,auVar17);
  iVar56 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x180);
  iVar59 = -iVar56;
  auVar86._4_4_ = iVar59;
  auVar86._0_4_ = iVar59;
  auVar86._8_4_ = iVar59;
  auVar86._12_4_ = iVar59;
  auVar86._16_4_ = iVar59;
  auVar86._20_4_ = iVar59;
  auVar86._24_4_ = iVar59;
  auVar86._28_4_ = iVar59;
  iVar59 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x240);
  auVar121._4_4_ = iVar59;
  auVar121._0_4_ = iVar59;
  auVar121._8_4_ = iVar59;
  auVar121._12_4_ = iVar59;
  auVar121._16_4_ = iVar59;
  auVar121._20_4_ = iVar59;
  auVar121._24_4_ = iVar59;
  auVar121._28_4_ = iVar59;
  auVar28 = vpmulld_avx2(auVar14,auVar86);
  auVar28 = vpaddd_avx2(auVar28,auVar85);
  auVar43 = vpmulld_avx2(auVar82,auVar121);
  auVar28 = vpaddd_avx2(auVar28,auVar43);
  auVar14 = vpmulld_avx2(auVar14,auVar121);
  auVar82 = vpmulld_avx2(auVar86,auVar82);
  auVar14 = vpaddd_avx2(auVar14,auVar85);
  auVar51 = vpsubd_avx2(auVar14,auVar82);
  auVar14 = vpmulld_avx2(auVar15,auVar86);
  auVar14 = vpaddd_avx2(auVar14,auVar85);
  auVar82 = vpmulld_avx2(auVar26,auVar121);
  auVar14 = vpaddd_avx2(auVar14,auVar82);
  auVar15 = vpmulld_avx2(auVar15,auVar121);
  auVar26 = vpmulld_avx2(auVar86,auVar26);
  auVar15 = vpaddd_avx2(auVar15,auVar85);
  auVar69 = vpsubd_avx2(auVar15,auVar26);
  iVar59 = -iVar59;
  auVar135._4_4_ = iVar59;
  auVar135._0_4_ = iVar59;
  auVar135._8_4_ = iVar59;
  auVar135._12_4_ = iVar59;
  auVar135._16_4_ = iVar59;
  auVar135._20_4_ = iVar59;
  auVar135._24_4_ = iVar59;
  auVar135._28_4_ = iVar59;
  auVar15 = vpmulld_avx2(auVar84,auVar135);
  auVar15 = vpaddd_avx2(auVar15,auVar85);
  auVar26 = vpmulld_avx2(auVar93,auVar86);
  auVar15 = vpaddd_avx2(auVar15,auVar26);
  auVar26 = vpmulld_avx2(auVar84,auVar86);
  auVar82 = vpmulld_avx2(auVar135,auVar93);
  auVar26 = vpaddd_avx2(auVar26,auVar85);
  auVar93 = vpsubd_avx2(auVar26,auVar82);
  auVar26 = vpmulld_avx2(auVar81,auVar135);
  auVar26 = vpaddd_avx2(auVar26,auVar85);
  auVar82 = vpmulld_avx2(auVar67,auVar86);
  auVar26 = vpaddd_avx2(auVar26,auVar82);
  auVar82 = vpmulld_avx2(auVar81,auVar86);
  auVar43 = vpmulld_avx2(auVar135,auVar67);
  auVar82 = vpaddd_avx2(auVar82,auVar85);
  auVar88 = vpsubd_avx2(auVar82,auVar43);
  iVar59 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x200);
  iVar60 = -iVar59;
  auVar142._4_4_ = iVar60;
  auVar142._0_4_ = iVar60;
  auVar142._8_4_ = iVar60;
  auVar142._12_4_ = iVar60;
  auVar142._16_4_ = iVar60;
  auVar142._20_4_ = iVar60;
  auVar142._24_4_ = iVar60;
  auVar142._28_4_ = iVar60;
  iVar60 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x1c0);
  auVar143._4_4_ = iVar60;
  auVar143._0_4_ = iVar60;
  auVar143._8_4_ = iVar60;
  auVar143._12_4_ = iVar60;
  auVar143._16_4_ = iVar60;
  auVar143._20_4_ = iVar60;
  auVar143._24_4_ = iVar60;
  auVar143._28_4_ = iVar60;
  auVar82 = vpmulld_avx2(auVar99,auVar142);
  auVar82 = vpaddd_avx2(auVar82,auVar85);
  auVar43 = vpmulld_avx2(auVar87,auVar143);
  auVar82 = vpaddd_avx2(auVar82,auVar43);
  auVar43 = vpmulld_avx2(auVar99,auVar143);
  auVar87 = vpmulld_avx2(auVar142,auVar87);
  auVar43 = vpaddd_avx2(auVar43,auVar85);
  auVar99 = vpsubd_avx2(auVar43,auVar87);
  auVar43 = vpmulld_avx2(auVar53,auVar142);
  auVar43 = vpaddd_avx2(auVar43,auVar85);
  auVar87 = vpmulld_avx2(auVar73,auVar143);
  auVar43 = vpaddd_avx2(auVar43,auVar87);
  auVar87 = vpmulld_avx2(auVar53,auVar143);
  auVar73 = vpmulld_avx2(auVar142,auVar73);
  auVar87 = vpaddd_avx2(auVar87,auVar85);
  auVar53 = vpsubd_avx2(auVar87,auVar73);
  iVar60 = -iVar60;
  auVar101._4_4_ = iVar60;
  auVar101._0_4_ = iVar60;
  auVar101._8_4_ = iVar60;
  auVar101._12_4_ = iVar60;
  auVar101._16_4_ = iVar60;
  auVar101._20_4_ = iVar60;
  auVar101._24_4_ = iVar60;
  auVar101._28_4_ = iVar60;
  auVar87 = vpmulld_avx2(auVar21,auVar101);
  auVar87 = vpaddd_avx2(auVar87,auVar85);
  auVar73 = vpmulld_avx2(auVar137,auVar142);
  auVar87 = vpaddd_avx2(auVar73,auVar87);
  auVar21 = vpmulld_avx2(auVar21,auVar142);
  auVar137 = vpmulld_avx2(auVar101,auVar137);
  auVar21 = vpaddd_avx2(auVar21,auVar85);
  auVar76 = vpsubd_avx2(auVar21,auVar137);
  auVar21 = vpmulld_avx2(auVar19,auVar101);
  auVar21 = vpaddd_avx2(auVar21,auVar85);
  auVar137 = vpmulld_avx2(auVar24,auVar142);
  auVar21 = vpaddd_avx2(auVar137,auVar21);
  auVar19 = vpmulld_avx2(auVar19,auVar142);
  auVar24 = vpmulld_avx2(auVar101,auVar24);
  auVar19 = vpaddd_avx2(auVar19,auVar85);
  auVar80 = vpsubd_avx2(auVar19,auVar24);
  auVar137._4_4_ = iVar56;
  auVar137._0_4_ = iVar56;
  auVar137._8_4_ = iVar56;
  auVar137._12_4_ = iVar56;
  auVar137._16_4_ = iVar56;
  auVar137._20_4_ = iVar56;
  auVar137._24_4_ = iVar56;
  auVar137._28_4_ = iVar56;
  auVar19 = vpmulld_avx2(auVar7,auVar121);
  auVar19 = vpaddd_avx2(auVar19,auVar85);
  auVar24 = vpmulld_avx2(auVar66,auVar137);
  auVar19 = vpaddd_avx2(auVar19,auVar24);
  auVar7 = vpmulld_avx2(auVar137,auVar7);
  auVar24 = vpmulld_avx2(auVar66,auVar121);
  auVar7 = vpsubd_avx2(auVar85,auVar7);
  auVar7 = vpaddd_avx2(auVar24,auVar7);
  auVar138._4_4_ = iVar59;
  auVar138._0_4_ = iVar59;
  auVar138._8_4_ = iVar59;
  auVar138._12_4_ = iVar59;
  auVar138._16_4_ = iVar59;
  auVar138._20_4_ = iVar59;
  auVar138._24_4_ = iVar59;
  auVar138._28_4_ = iVar59;
  auVar24 = vpmulld_avx2(auVar94,auVar143);
  auVar24 = vpaddd_avx2(auVar24,auVar85);
  auVar137 = vpmulld_avx2(auVar72,auVar138);
  auVar24 = vpaddd_avx2(auVar24,auVar137);
  auVar137 = vpmulld_avx2(auVar138,auVar94);
  auVar66 = vpmulld_avx2(auVar72,auVar143);
  auVar137 = vpsubd_avx2(auVar85,auVar137);
  auVar137 = vpaddd_avx2(auVar66,auVar137);
  auVar70 = vpsrad_avx2(auVar70,auVar65);
  auVar66 = vpaddd_avx2(auVar5,auVar70);
  auVar94 = vpsubd_avx2(auVar5,auVar70);
  auVar4 = vpsrad_avx2(auVar4,auVar65);
  auVar72 = vpsubd_avx2(auVar50,auVar4);
  auVar4 = vpaddd_avx2(auVar50,auVar4);
  auVar70 = vpsrad_avx2(auVar46,auVar65);
  auVar5 = vpaddd_avx2(auVar47,auVar70);
  auVar46 = vpsubd_avx2(auVar47,auVar70);
  auVar70 = vpsrad_avx2(auVar75,auVar65);
  auVar47 = vpsubd_avx2(auVar8,auVar70);
  auVar8 = vpaddd_avx2(auVar8,auVar70);
  auVar70 = vpmulld_avx2(auVar6,auVar86);
  auVar70 = vpaddd_avx2(auVar70,auVar85);
  auVar73 = vpmulld_avx2(auVar17,auVar121);
  auVar70 = vpaddd_avx2(auVar70,auVar73);
  auVar6 = vpmulld_avx2(auVar6,auVar121);
  auVar17 = vpmulld_avx2(auVar86,auVar17);
  auVar6 = vpaddd_avx2(auVar6,auVar85);
  auVar50 = vpsubd_avx2(auVar6,auVar17);
  auVar6 = vpmulld_avx2(auVar124,auVar135);
  auVar6 = vpaddd_avx2(auVar6,auVar85);
  auVar17 = vpmulld_avx2(auVar71,auVar86);
  auVar6 = vpaddd_avx2(auVar17,auVar6);
  auVar17 = vpmulld_avx2(auVar124,auVar86);
  auVar73 = vpmulld_avx2(auVar135,auVar71);
  auVar17 = vpaddd_avx2(auVar17,auVar85);
  auVar71 = vpsubd_avx2(auVar17,auVar73);
  auVar17 = vpmulld_avx2(auVar48,auVar142);
  auVar17 = vpaddd_avx2(auVar17,auVar85);
  auVar73 = vpmulld_avx2(auVar98,auVar143);
  auVar17 = vpaddd_avx2(auVar17,auVar73);
  auVar73 = vpmulld_avx2(auVar48,auVar143);
  auVar67 = vpmulld_avx2(auVar142,auVar98);
  auVar73 = vpaddd_avx2(auVar73,auVar85);
  auVar48 = vpsubd_avx2(auVar73,auVar67);
  auVar73 = vpmulld_avx2(auVar11,auVar101);
  auVar73 = vpaddd_avx2(auVar73,auVar85);
  auVar67 = vpmulld_avx2(auVar74,auVar142);
  auVar73 = vpaddd_avx2(auVar73,auVar67);
  auVar11 = vpmulld_avx2(auVar11,auVar142);
  auVar74 = vpmulld_avx2(auVar101,auVar74);
  auVar11 = vpaddd_avx2(auVar11,auVar85);
  auVar98 = vpsubd_avx2(auVar11,auVar74);
  auVar14 = vpsrad_avx2(auVar14,auVar65);
  auVar11 = vpaddd_avx2(auVar14,auVar20);
  auVar75 = vpsubd_avx2(auVar20,auVar14);
  auVar20 = vpsrad_avx2(auVar28,auVar65);
  auVar14 = vpaddd_avx2(auVar20,auVar13);
  auVar124 = vpsubd_avx2(auVar13,auVar20);
  auVar13 = vpsrad_avx2(auVar15,auVar65);
  auVar86 = vpsubd_avx2(auVar79,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar79);
  auVar15 = vpsrad_avx2(auVar26,auVar65);
  auVar79 = vpsubd_avx2(auVar54,auVar15);
  auVar15 = vpaddd_avx2(auVar15,auVar54);
  auVar65 = ZEXT416(uVar55);
  auVar26 = vpsrad_avx2(auVar43,auVar65);
  auVar20 = vpaddd_avx2(auVar26,auVar90);
  auVar54 = vpsubd_avx2(auVar90,auVar26);
  auVar82 = vpsrad_avx2(auVar82,auVar65);
  auVar26 = vpaddd_avx2(auVar82,auVar52);
  auVar52 = vpsubd_avx2(auVar52,auVar82);
  auVar82 = vpsrad_avx2(auVar87,auVar65);
  auVar77 = vpsubd_avx2(auVar16,auVar82);
  auVar16 = vpaddd_avx2(auVar82,auVar16);
  auVar21 = vpsrad_avx2(auVar21,auVar65);
  auVar81 = vpsubd_avx2(auVar18,auVar21);
  auVar18 = vpaddd_avx2(auVar21,auVar18);
  auVar82 = vpsrad_avx2(auVar76,auVar65);
  auVar21 = vpaddd_avx2(auVar82,auVar22);
  auVar76 = vpsubd_avx2(auVar22,auVar82);
  auVar82 = vpsrad_avx2(auVar80,auVar65);
  auVar22 = vpaddd_avx2(auVar82,auVar78);
  auVar80 = vpsubd_avx2(auVar78,auVar82);
  auVar78 = vpsrad_avx2(auVar53,auVar65);
  auVar53 = vpsubd_avx2(auVar92,auVar78);
  auVar78 = vpaddd_avx2(auVar78,auVar92);
  auVar82 = vpsrad_avx2(auVar99,auVar65);
  auVar92 = vpsubd_avx2(auVar68,auVar82);
  auVar82 = vpaddd_avx2(auVar82,auVar68);
  auVar28 = vpsrad_avx2(auVar93,auVar65);
  auVar74 = vpaddd_avx2(auVar28,auVar83);
  auVar99 = vpsubd_avx2(auVar83,auVar28);
  auVar43 = vpsrad_avx2(auVar88,auVar65);
  auVar28 = vpaddd_avx2(auVar43,auVar102);
  auVar83 = vpsubd_avx2(auVar102,auVar43);
  auVar43 = vpsrad_avx2(auVar69,auVar65);
  auVar69 = vpsubd_avx2(auVar23,auVar43);
  auVar23 = vpaddd_avx2(auVar43,auVar23);
  auVar43 = vpsrad_avx2(auVar51,auVar65);
  auVar68 = vpsubd_avx2(auVar25,auVar43);
  auVar25 = vpaddd_avx2(auVar43,auVar25);
  iVar56 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x170);
  iVar59 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x250);
  auVar122._4_4_ = iVar59;
  auVar122._0_4_ = iVar59;
  auVar122._8_4_ = iVar59;
  auVar122._12_4_ = iVar59;
  auVar122._16_4_ = iVar59;
  auVar122._20_4_ = iVar59;
  auVar122._24_4_ = iVar59;
  auVar122._28_4_ = iVar59;
  auVar67._4_4_ = iVar56;
  auVar67._0_4_ = iVar56;
  auVar67._8_4_ = iVar56;
  auVar67._12_4_ = iVar56;
  auVar67._16_4_ = iVar56;
  auVar67._20_4_ = iVar56;
  auVar67._24_4_ = iVar56;
  auVar67._28_4_ = iVar56;
  auVar43 = vpmulld_avx2(auVar122,auVar66);
  auVar43 = vpaddd_avx2(auVar43,auVar85);
  auVar87 = vpmulld_avx2(auVar67,auVar8);
  auVar43 = vpaddd_avx2(auVar43,auVar87);
  auVar66 = vpmulld_avx2(auVar66,auVar67);
  auVar8 = vpmulld_avx2(auVar122,auVar8);
  auVar8 = vpaddd_avx2(auVar8,auVar85);
  auVar51 = vpsubd_avx2(auVar8,auVar66);
  iVar60 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x1d0);
  auVar140._4_4_ = iVar60;
  auVar140._0_4_ = iVar60;
  auVar140._8_4_ = iVar60;
  auVar140._12_4_ = iVar60;
  auVar140._16_4_ = iVar60;
  auVar140._20_4_ = iVar60;
  auVar140._24_4_ = iVar60;
  auVar140._28_4_ = iVar60;
  iVar64 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x1f0);
  auVar87._4_4_ = iVar64;
  auVar87._0_4_ = iVar64;
  auVar87._8_4_ = iVar64;
  auVar87._12_4_ = iVar64;
  auVar87._16_4_ = iVar64;
  auVar87._20_4_ = iVar64;
  auVar87._24_4_ = iVar64;
  auVar87._28_4_ = iVar64;
  auVar8 = vpmulld_avx2(auVar140,auVar94);
  auVar8 = vpaddd_avx2(auVar8,auVar85);
  auVar66 = vpmulld_avx2(auVar87,auVar47);
  auVar8 = vpaddd_avx2(auVar8,auVar66);
  auVar87 = vpmulld_avx2(auVar94,auVar87);
  auVar66 = vpmulld_avx2(auVar140,auVar47);
  auVar66 = vpaddd_avx2(auVar66,auVar85);
  auVar47 = vpsubd_avx2(auVar66,auVar87);
  iVar62 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x210);
  auVar88._4_4_ = iVar62;
  auVar88._0_4_ = iVar62;
  auVar88._8_4_ = iVar62;
  auVar88._12_4_ = iVar62;
  auVar88._16_4_ = iVar62;
  auVar88._20_4_ = iVar62;
  auVar88._24_4_ = iVar62;
  auVar88._28_4_ = iVar62;
  iVar57 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x1b0);
  auVar102._4_4_ = iVar57;
  auVar102._0_4_ = iVar57;
  auVar102._8_4_ = iVar57;
  auVar102._12_4_ = iVar57;
  auVar102._16_4_ = iVar57;
  auVar102._20_4_ = iVar57;
  auVar102._24_4_ = iVar57;
  auVar102._28_4_ = iVar57;
  auVar66 = vpmulld_avx2(auVar88,auVar72);
  auVar66 = vpaddd_avx2(auVar66,auVar85);
  auVar87 = vpmulld_avx2(auVar102,auVar46);
  auVar66 = vpaddd_avx2(auVar66,auVar87);
  auVar67 = vpmulld_avx2(auVar72,auVar102);
  auVar87 = vpmulld_avx2(auVar88,auVar46);
  auVar87 = vpaddd_avx2(auVar87,auVar85);
  auVar46 = vpsubd_avx2(auVar87,auVar67);
  iVar61 = *(int *)((long)vert_filter_length_chroma + lVar58 + 400);
  auVar103._4_4_ = iVar61;
  auVar103._0_4_ = iVar61;
  auVar103._8_4_ = iVar61;
  auVar103._12_4_ = iVar61;
  auVar103._16_4_ = iVar61;
  auVar103._20_4_ = iVar61;
  auVar103._24_4_ = iVar61;
  auVar103._28_4_ = iVar61;
  iVar63 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x230);
  auVar136._4_4_ = iVar63;
  auVar136._0_4_ = iVar63;
  auVar136._8_4_ = iVar63;
  auVar136._12_4_ = iVar63;
  auVar136._16_4_ = iVar63;
  auVar136._20_4_ = iVar63;
  auVar136._24_4_ = iVar63;
  auVar136._28_4_ = iVar63;
  auVar87 = vpmulld_avx2(auVar103,auVar4);
  auVar87 = vpaddd_avx2(auVar87,auVar85);
  auVar67 = vpmulld_avx2(auVar136,auVar5);
  auVar87 = vpaddd_avx2(auVar67,auVar87);
  auVar67 = vpmulld_avx2(auVar4,auVar136);
  auVar4 = vpmulld_avx2(auVar103,auVar5);
  auVar4 = vpaddd_avx2(auVar4,auVar85);
  auVar102 = vpsubd_avx2(auVar4,auVar67);
  auVar5 = vpsrad_avx2(auVar70,auVar65);
  auVar4 = vpaddd_avx2(auVar5,auVar10);
  auVar93 = vpsubd_avx2(auVar10,auVar5);
  auVar5 = vpsrad_avx2(auVar6,auVar65);
  auVar94 = vpsubd_avx2(auVar97,auVar5);
  auVar5 = vpaddd_avx2(auVar5,auVar97);
  auVar10 = vpsrad_avx2(auVar17,auVar65);
  auVar6 = vpaddd_avx2(auVar10,auVar89);
  auVar97 = vpsubd_avx2(auVar89,auVar10);
  auVar10 = vpsrad_avx2(auVar73,auVar65);
  auVar72 = vpsubd_avx2(auVar9,auVar10);
  auVar9 = vpaddd_avx2(auVar10,auVar9);
  auVar17 = vpsrad_avx2(auVar98,auVar65);
  auVar10 = vpaddd_avx2(auVar17,auVar96);
  auVar98 = vpsubd_avx2(auVar96,auVar17);
  auVar17 = vpsrad_avx2(auVar48,auVar65);
  auVar48 = vpsubd_avx2(auVar49,auVar17);
  auVar17 = vpaddd_avx2(auVar17,auVar49);
  auVar70 = vpsrad_avx2(auVar71,auVar65);
  auVar96 = vpaddd_avx2(auVar70,auVar123);
  auVar71 = vpsubd_avx2(auVar123,auVar70);
  auVar70 = vpsrad_avx2(auVar50,auVar65);
  auVar49 = vpsubd_avx2(auVar12,auVar70);
  auVar12 = vpaddd_avx2(auVar12,auVar70);
  iVar56 = -iVar56;
  auVar144._4_4_ = iVar56;
  auVar144._0_4_ = iVar56;
  auVar144._8_4_ = iVar56;
  auVar144._12_4_ = iVar56;
  auVar144._16_4_ = iVar56;
  auVar144._20_4_ = iVar56;
  auVar144._24_4_ = iVar56;
  auVar144._28_4_ = iVar56;
  auVar70 = vpmulld_avx2(auVar122,auVar25);
  auVar70 = vpaddd_avx2(auVar70,auVar85);
  auVar73 = vpmulld_avx2(auVar144,auVar14);
  auVar70 = vpaddd_avx2(auVar70,auVar73);
  auVar14 = vpmulld_avx2(auVar122,auVar14);
  auVar25 = vpmulld_avx2(auVar25,auVar144);
  auVar14 = vpaddd_avx2(auVar14,auVar85);
  auVar50 = vpsubd_avx2(auVar14,auVar25);
  iVar59 = -iVar59;
  auVar123._4_4_ = iVar59;
  auVar123._0_4_ = iVar59;
  auVar123._8_4_ = iVar59;
  auVar123._12_4_ = iVar59;
  auVar123._16_4_ = iVar59;
  auVar123._20_4_ = iVar59;
  auVar123._24_4_ = iVar59;
  auVar123._28_4_ = iVar59;
  auVar14 = vpmulld_avx2(auVar123,auVar124);
  auVar14 = vpaddd_avx2(auVar14,auVar85);
  auVar25 = vpmulld_avx2(auVar144,auVar68);
  auVar14 = vpaddd_avx2(auVar14,auVar25);
  auVar25 = vpmulld_avx2(auVar144,auVar124);
  auVar73 = vpmulld_avx2(auVar68,auVar123);
  auVar73 = vpsubd_avx2(auVar85,auVar73);
  auVar25 = vpaddd_avx2(auVar25,auVar73);
  iVar64 = -iVar64;
  auVar124._4_4_ = iVar64;
  auVar124._0_4_ = iVar64;
  auVar124._8_4_ = iVar64;
  auVar124._12_4_ = iVar64;
  auVar124._16_4_ = iVar64;
  auVar124._20_4_ = iVar64;
  auVar124._24_4_ = iVar64;
  auVar124._28_4_ = iVar64;
  auVar73 = vpmulld_avx2(auVar140,auVar83);
  auVar73 = vpaddd_avx2(auVar73,auVar85);
  auVar67 = vpmulld_avx2(auVar124,auVar79);
  auVar73 = vpaddd_avx2(auVar73,auVar67);
  auVar67 = vpmulld_avx2(auVar140,auVar79);
  auVar83 = vpmulld_avx2(auVar83,auVar124);
  auVar67 = vpaddd_avx2(auVar67,auVar85);
  auVar123 = vpsubd_avx2(auVar67,auVar83);
  iVar60 = -iVar60;
  auVar68._4_4_ = iVar60;
  auVar68._0_4_ = iVar60;
  auVar68._8_4_ = iVar60;
  auVar68._12_4_ = iVar60;
  auVar68._16_4_ = iVar60;
  auVar68._20_4_ = iVar60;
  auVar68._24_4_ = iVar60;
  auVar68._28_4_ = iVar60;
  auVar67 = vpmulld_avx2(auVar68,auVar15);
  auVar67 = vpaddd_avx2(auVar67,auVar85);
  auVar83 = vpmulld_avx2(auVar124,auVar28);
  auVar67 = vpaddd_avx2(auVar67,auVar83);
  auVar15 = vpmulld_avx2(auVar124,auVar15);
  auVar28 = vpmulld_avx2(auVar28,auVar68);
  auVar28 = vpsubd_avx2(auVar85,auVar28);
  auVar15 = vpaddd_avx2(auVar28,auVar15);
  iVar57 = -iVar57;
  auVar125._4_4_ = iVar57;
  auVar125._0_4_ = iVar57;
  auVar125._8_4_ = iVar57;
  auVar125._12_4_ = iVar57;
  auVar125._16_4_ = iVar57;
  auVar125._20_4_ = iVar57;
  auVar125._24_4_ = iVar57;
  auVar125._28_4_ = iVar57;
  auVar28 = vpmulld_avx2(auVar88,auVar82);
  auVar28 = vpaddd_avx2(auVar28,auVar85);
  auVar83 = vpmulld_avx2(auVar125,auVar26);
  auVar28 = vpaddd_avx2(auVar83,auVar28);
  auVar26 = vpmulld_avx2(auVar88,auVar26);
  auVar82 = vpmulld_avx2(auVar82,auVar125);
  auVar26 = vpaddd_avx2(auVar26,auVar85);
  auVar124 = vpsubd_avx2(auVar26,auVar82);
  iVar62 = -iVar62;
  auVar89._4_4_ = iVar62;
  auVar89._0_4_ = iVar62;
  auVar89._8_4_ = iVar62;
  auVar89._12_4_ = iVar62;
  auVar89._16_4_ = iVar62;
  auVar89._20_4_ = iVar62;
  auVar89._24_4_ = iVar62;
  auVar89._28_4_ = iVar62;
  auVar26 = vpmulld_avx2(auVar89,auVar52);
  auVar26 = vpaddd_avx2(auVar26,auVar85);
  auVar82 = vpmulld_avx2(auVar125,auVar92);
  auVar26 = vpaddd_avx2(auVar26,auVar82);
  auVar82 = vpmulld_avx2(auVar125,auVar52);
  auVar83 = vpmulld_avx2(auVar92,auVar89);
  auVar83 = vpsubd_avx2(auVar85,auVar83);
  auVar82 = vpaddd_avx2(auVar83,auVar82);
  iVar63 = -iVar63;
  auVar90._4_4_ = iVar63;
  auVar90._0_4_ = iVar63;
  auVar90._8_4_ = iVar63;
  auVar90._12_4_ = iVar63;
  auVar90._16_4_ = iVar63;
  auVar90._20_4_ = iVar63;
  auVar90._24_4_ = iVar63;
  auVar90._28_4_ = iVar63;
  auVar83 = vpmulld_avx2(auVar103,auVar80);
  auVar83 = vpaddd_avx2(auVar83,auVar85);
  auVar68 = vpmulld_avx2(auVar90,auVar81);
  auVar83 = vpaddd_avx2(auVar68,auVar83);
  auVar68 = vpmulld_avx2(auVar103,auVar81);
  auVar92 = vpmulld_avx2(auVar80,auVar90);
  auVar68 = vpaddd_avx2(auVar68,auVar85);
  auVar52 = vpsubd_avx2(auVar68,auVar92);
  iVar61 = -iVar61;
  auVar104._4_4_ = iVar61;
  auVar104._0_4_ = iVar61;
  auVar104._8_4_ = iVar61;
  auVar104._12_4_ = iVar61;
  auVar104._16_4_ = iVar61;
  auVar104._20_4_ = iVar61;
  auVar104._24_4_ = iVar61;
  auVar104._28_4_ = iVar61;
  auVar68 = vpmulld_avx2(auVar104,auVar18);
  auVar68 = vpaddd_avx2(auVar68,auVar85);
  auVar92 = vpmulld_avx2(auVar90,auVar22);
  auVar68 = vpaddd_avx2(auVar92,auVar68);
  auVar18 = vpmulld_avx2(auVar90,auVar18);
  auVar22 = vpmulld_avx2(auVar22,auVar104);
  auVar22 = vpsubd_avx2(auVar85,auVar22);
  auVar18 = vpaddd_avx2(auVar22,auVar18);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 600);
  auVar91._4_4_ = uVar2;
  auVar91._0_4_ = uVar2;
  auVar91._8_4_ = uVar2;
  auVar91._12_4_ = uVar2;
  auVar91._16_4_ = uVar2;
  auVar91._20_4_ = uVar2;
  auVar91._24_4_ = uVar2;
  auVar91._28_4_ = uVar2;
  auVar22 = vpmulld_avx2(auVar91,auVar4);
  auVar22 = vpaddd_avx2(auVar22,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x168);
  auVar126._4_4_ = uVar2;
  auVar126._0_4_ = uVar2;
  auVar126._8_4_ = uVar2;
  auVar126._12_4_ = uVar2;
  auVar126._16_4_ = uVar2;
  auVar126._20_4_ = uVar2;
  auVar126._24_4_ = uVar2;
  auVar126._28_4_ = uVar2;
  auVar92 = vpmulld_avx2(auVar126,auVar12);
  auVar22 = vpaddd_avx2(auVar92,auVar22);
  auVar12 = vpmulld_avx2(auVar91,auVar12);
  auVar92 = vpmulld_avx2(auVar4,auVar126);
  auVar4 = vpaddd_avx2(auVar12,auVar85);
  auVar88 = vpsubd_avx2(auVar4,auVar92);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1d8);
  auVar92._4_4_ = uVar2;
  auVar92._0_4_ = uVar2;
  auVar92._8_4_ = uVar2;
  auVar92._12_4_ = uVar2;
  auVar92._16_4_ = uVar2;
  auVar92._20_4_ = uVar2;
  auVar92._24_4_ = uVar2;
  auVar92._28_4_ = uVar2;
  auVar4 = vpmulld_avx2(auVar92,auVar93);
  auVar4 = vpaddd_avx2(auVar4,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1e8);
  auVar127._4_4_ = uVar2;
  auVar127._0_4_ = uVar2;
  auVar127._8_4_ = uVar2;
  auVar127._12_4_ = uVar2;
  auVar127._16_4_ = uVar2;
  auVar127._20_4_ = uVar2;
  auVar127._24_4_ = uVar2;
  auVar127._28_4_ = uVar2;
  auVar12 = vpmulld_avx2(auVar127,auVar49);
  auVar4 = vpaddd_avx2(auVar4,auVar12);
  auVar12 = vpmulld_avx2(auVar92,auVar49);
  auVar92 = vpmulld_avx2(auVar93,auVar127);
  auVar12 = vpaddd_avx2(auVar12,auVar85);
  auVar49 = vpsubd_avx2(auVar12,auVar92);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x218);
  auVar93._4_4_ = uVar2;
  auVar93._0_4_ = uVar2;
  auVar93._8_4_ = uVar2;
  auVar93._12_4_ = uVar2;
  auVar93._16_4_ = uVar2;
  auVar93._20_4_ = uVar2;
  auVar93._24_4_ = uVar2;
  auVar93._28_4_ = uVar2;
  auVar12 = vpmulld_avx2(auVar93,auVar94);
  auVar12 = vpaddd_avx2(auVar12,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1a8);
  auVar128._4_4_ = uVar2;
  auVar128._0_4_ = uVar2;
  auVar128._8_4_ = uVar2;
  auVar128._12_4_ = uVar2;
  auVar128._16_4_ = uVar2;
  auVar128._20_4_ = uVar2;
  auVar128._24_4_ = uVar2;
  auVar128._28_4_ = uVar2;
  auVar92 = vpmulld_avx2(auVar128,auVar71);
  auVar12 = vpaddd_avx2(auVar12,auVar92);
  auVar92 = vpmulld_avx2(auVar93,auVar71);
  auVar71 = vpmulld_avx2(auVar94,auVar128);
  auVar92 = vpaddd_avx2(auVar92,auVar85);
  auVar93 = vpsubd_avx2(auVar92,auVar71);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x198);
  auVar94._4_4_ = uVar2;
  auVar94._0_4_ = uVar2;
  auVar94._8_4_ = uVar2;
  auVar94._12_4_ = uVar2;
  auVar94._16_4_ = uVar2;
  auVar94._20_4_ = uVar2;
  auVar94._24_4_ = uVar2;
  auVar94._28_4_ = uVar2;
  auVar92 = vpmulld_avx2(auVar94,auVar5);
  auVar92 = vpaddd_avx2(auVar92,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x228);
  auVar129._4_4_ = uVar2;
  auVar129._0_4_ = uVar2;
  auVar129._8_4_ = uVar2;
  auVar129._12_4_ = uVar2;
  auVar129._16_4_ = uVar2;
  auVar129._20_4_ = uVar2;
  auVar129._24_4_ = uVar2;
  auVar129._28_4_ = uVar2;
  auVar71 = vpmulld_avx2(auVar129,auVar96);
  auVar92 = vpaddd_avx2(auVar92,auVar71);
  auVar96 = vpmulld_avx2(auVar94,auVar96);
  auVar71 = vpmulld_avx2(auVar5,auVar129);
  auVar5 = vpaddd_avx2(auVar96,auVar85);
  auVar94 = vpsubd_avx2(auVar5,auVar71);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x238);
  auVar95._4_4_ = uVar2;
  auVar95._0_4_ = uVar2;
  auVar95._8_4_ = uVar2;
  auVar95._12_4_ = uVar2;
  auVar95._16_4_ = uVar2;
  auVar95._20_4_ = uVar2;
  auVar95._24_4_ = uVar2;
  auVar95._28_4_ = uVar2;
  auVar5 = vpmulld_avx2(auVar95,auVar6);
  auVar5 = vpaddd_avx2(auVar5,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x188);
  auVar130._4_4_ = uVar2;
  auVar130._0_4_ = uVar2;
  auVar130._8_4_ = uVar2;
  auVar130._12_4_ = uVar2;
  auVar130._16_4_ = uVar2;
  auVar130._20_4_ = uVar2;
  auVar130._24_4_ = uVar2;
  auVar130._28_4_ = uVar2;
  auVar96 = vpmulld_avx2(auVar130,auVar17);
  auVar5 = vpaddd_avx2(auVar5,auVar96);
  auVar17 = vpmulld_avx2(auVar95,auVar17);
  auVar96 = vpmulld_avx2(auVar6,auVar130);
  auVar6 = vpaddd_avx2(auVar17,auVar85);
  auVar89 = vpsubd_avx2(auVar6,auVar96);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1b8);
  auVar96._4_4_ = uVar2;
  auVar96._0_4_ = uVar2;
  auVar96._8_4_ = uVar2;
  auVar96._12_4_ = uVar2;
  auVar96._16_4_ = uVar2;
  auVar96._20_4_ = uVar2;
  auVar96._24_4_ = uVar2;
  auVar96._28_4_ = uVar2;
  auVar6 = vpmulld_avx2(auVar96,auVar97);
  auVar6 = vpaddd_avx2(auVar6,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x208);
  auVar131._4_4_ = uVar2;
  auVar131._0_4_ = uVar2;
  auVar131._8_4_ = uVar2;
  auVar131._12_4_ = uVar2;
  auVar131._16_4_ = uVar2;
  auVar131._20_4_ = uVar2;
  auVar131._24_4_ = uVar2;
  auVar131._28_4_ = uVar2;
  auVar17 = vpmulld_avx2(auVar131,auVar48);
  auVar6 = vpaddd_avx2(auVar6,auVar17);
  auVar17 = vpmulld_avx2(auVar96,auVar48);
  auVar96 = vpmulld_avx2(auVar97,auVar131);
  auVar17 = vpaddd_avx2(auVar17,auVar85);
  auVar48 = vpsubd_avx2(auVar17,auVar96);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1f8);
  auVar97._4_4_ = uVar2;
  auVar97._0_4_ = uVar2;
  auVar97._8_4_ = uVar2;
  auVar97._12_4_ = uVar2;
  auVar97._16_4_ = uVar2;
  auVar97._20_4_ = uVar2;
  auVar97._24_4_ = uVar2;
  auVar97._28_4_ = uVar2;
  auVar17 = vpmulld_avx2(auVar97,auVar72);
  auVar17 = vpaddd_avx2(auVar17,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1c8);
  auVar132._4_4_ = uVar2;
  auVar132._0_4_ = uVar2;
  auVar132._8_4_ = uVar2;
  auVar132._12_4_ = uVar2;
  auVar132._16_4_ = uVar2;
  auVar132._20_4_ = uVar2;
  auVar132._24_4_ = uVar2;
  auVar132._28_4_ = uVar2;
  auVar96 = vpmulld_avx2(auVar132,auVar98);
  auVar17 = vpaddd_avx2(auVar17,auVar96);
  auVar96 = vpmulld_avx2(auVar97,auVar98);
  auVar71 = vpmulld_avx2(auVar72,auVar132);
  auVar96 = vpaddd_avx2(auVar96,auVar85);
  auVar97 = vpsubd_avx2(auVar96,auVar71);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x178);
  auVar98._4_4_ = uVar2;
  auVar98._0_4_ = uVar2;
  auVar98._8_4_ = uVar2;
  auVar98._12_4_ = uVar2;
  auVar98._16_4_ = uVar2;
  auVar98._20_4_ = uVar2;
  auVar98._24_4_ = uVar2;
  auVar98._28_4_ = uVar2;
  auVar96 = vpmulld_avx2(auVar98,auVar9);
  auVar96 = vpaddd_avx2(auVar96,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x248);
  auVar133._4_4_ = uVar2;
  auVar133._0_4_ = uVar2;
  auVar133._8_4_ = uVar2;
  auVar133._12_4_ = uVar2;
  auVar133._16_4_ = uVar2;
  auVar133._20_4_ = uVar2;
  auVar133._24_4_ = uVar2;
  auVar133._28_4_ = uVar2;
  auVar71 = vpmulld_avx2(auVar133,auVar10);
  auVar96 = vpaddd_avx2(auVar96,auVar71);
  auVar10 = vpmulld_avx2(auVar98,auVar10);
  auVar71 = vpmulld_avx2(auVar9,auVar133);
  auVar9 = vpaddd_avx2(auVar10,auVar85);
  auVar98 = vpsubd_avx2(auVar9,auVar71);
  auVar10 = vpsrad_avx2(auVar70,auVar65);
  auVar9 = vpaddd_avx2(auVar10,auVar11);
  auVar71 = vpsubd_avx2(auVar11,auVar10);
  auVar10 = vpsrad_avx2(auVar14,auVar65);
  auVar72 = vpsubd_avx2(auVar75,auVar10);
  auVar10 = vpaddd_avx2(auVar10,auVar75);
  auVar14 = vpsrad_avx2(auVar73,auVar65);
  auVar11 = vpaddd_avx2(auVar14,auVar86);
  auVar75 = vpsubd_avx2(auVar86,auVar14);
  auVar14 = vpsrad_avx2(auVar67,auVar65);
  auVar67 = vpsubd_avx2(auVar13,auVar14);
  auVar13 = vpaddd_avx2(auVar14,auVar13);
  auVar28 = vpsrad_avx2(auVar28,auVar65);
  auVar14 = vpaddd_avx2(auVar28,auVar20);
  auVar79 = vpsubd_avx2(auVar20,auVar28);
  auVar20 = vpsrad_avx2(auVar26,auVar65);
  auVar80 = vpsubd_avx2(auVar54,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar54);
  auVar28 = vpsrad_avx2(auVar83,auVar65);
  auVar26 = vpaddd_avx2(auVar28,auVar77);
  auVar83 = vpsubd_avx2(auVar77,auVar28);
  auVar28 = vpsrad_avx2(auVar68,auVar65);
  auVar68 = vpsubd_avx2(auVar16,auVar28);
  auVar16 = vpaddd_avx2(auVar28,auVar16);
  auVar28 = vpsrad_avx2(auVar18,auVar65);
  auVar18 = vpaddd_avx2(auVar28,auVar21);
  auVar54 = vpsubd_avx2(auVar21,auVar28);
  auVar21 = vpsrad_avx2(auVar52,auVar65);
  auVar52 = vpsubd_avx2(auVar76,auVar21);
  auVar21 = vpaddd_avx2(auVar21,auVar76);
  auVar28 = vpsrad_avx2(auVar82,auVar65);
  auVar82 = vpaddd_avx2(auVar28,auVar53);
  auVar53 = vpsubd_avx2(auVar53,auVar28);
  auVar28 = vpsrad_avx2(auVar124,auVar65);
  auVar124 = vpsubd_avx2(auVar78,auVar28);
  auVar78 = vpaddd_avx2(auVar28,auVar78);
  auVar28 = vpsrad_avx2(auVar15,auVar65);
  auVar15 = vpaddd_avx2(auVar28,auVar74);
  auVar76 = vpsubd_avx2(auVar74,auVar28);
  auVar74 = vpsrad_avx2(auVar123,auVar65);
  auVar123 = vpsubd_avx2(auVar99,auVar74);
  auVar74 = vpaddd_avx2(auVar74,auVar99);
  auVar28 = vpsrad_avx2(auVar25,auVar65);
  auVar25 = vpaddd_avx2(auVar28,auVar69);
  auVar73 = vpsubd_avx2(auVar69,auVar28);
  auVar28 = vpsrad_avx2(auVar50,auVar65);
  auVar50 = vpsubd_avx2(auVar23,auVar28);
  auVar23 = vpaddd_avx2(auVar28,auVar23);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x25c);
  auVar99._4_4_ = uVar2;
  auVar99._0_4_ = uVar2;
  auVar99._8_4_ = uVar2;
  auVar99._12_4_ = uVar2;
  auVar99._16_4_ = uVar2;
  auVar99._20_4_ = uVar2;
  auVar99._24_4_ = uVar2;
  auVar99._28_4_ = uVar2;
  auVar28 = vpmulld_avx2(auVar99,auVar9);
  auVar28 = vpaddd_avx2(auVar28,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x164);
  auVar69._4_4_ = uVar2;
  auVar69._0_4_ = uVar2;
  auVar69._8_4_ = uVar2;
  auVar69._12_4_ = uVar2;
  auVar69._16_4_ = uVar2;
  auVar69._20_4_ = uVar2;
  auVar69._24_4_ = uVar2;
  auVar69._28_4_ = uVar2;
  auVar70 = vpmulld_avx2(auVar69,auVar23);
  auVar28 = vpaddd_avx2(auVar28,auVar70);
  auVar23 = vpmulld_avx2(auVar99,auVar23);
  auVar70 = vpmulld_avx2(auVar9,auVar69);
  auVar9 = vpaddd_avx2(auVar23,auVar85);
  auVar69 = vpsubd_avx2(auVar9,auVar70);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1dc);
  auVar70._4_4_ = uVar2;
  auVar70._0_4_ = uVar2;
  auVar70._8_4_ = uVar2;
  auVar70._12_4_ = uVar2;
  auVar70._16_4_ = uVar2;
  auVar70._20_4_ = uVar2;
  auVar70._24_4_ = uVar2;
  auVar70._28_4_ = uVar2;
  auVar9 = vpmulld_avx2(auVar70,auVar71);
  auVar9 = vpaddd_avx2(auVar9,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1e4);
  auVar105._4_4_ = uVar2;
  auVar105._0_4_ = uVar2;
  auVar105._8_4_ = uVar2;
  auVar105._12_4_ = uVar2;
  auVar105._16_4_ = uVar2;
  auVar105._20_4_ = uVar2;
  auVar105._24_4_ = uVar2;
  auVar105._28_4_ = uVar2;
  auVar23 = vpmulld_avx2(auVar105,auVar50);
  auVar9 = vpaddd_avx2(auVar23,auVar9);
  auVar23 = vpmulld_avx2(auVar70,auVar50);
  auVar70 = vpmulld_avx2(auVar71,auVar105);
  auVar23 = vpaddd_avx2(auVar23,auVar85);
  auVar50 = vpsubd_avx2(auVar23,auVar70);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x21c);
  auVar71._4_4_ = uVar2;
  auVar71._0_4_ = uVar2;
  auVar71._8_4_ = uVar2;
  auVar71._12_4_ = uVar2;
  auVar71._16_4_ = uVar2;
  auVar71._20_4_ = uVar2;
  auVar71._24_4_ = uVar2;
  auVar71._28_4_ = uVar2;
  auVar23 = vpmulld_avx2(auVar71,auVar72);
  auVar23 = vpaddd_avx2(auVar23,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1a4);
  auVar106._4_4_ = uVar2;
  auVar106._0_4_ = uVar2;
  auVar106._8_4_ = uVar2;
  auVar106._12_4_ = uVar2;
  auVar106._16_4_ = uVar2;
  auVar106._20_4_ = uVar2;
  auVar106._24_4_ = uVar2;
  auVar106._28_4_ = uVar2;
  auVar70 = vpmulld_avx2(auVar106,auVar73);
  auVar23 = vpaddd_avx2(auVar23,auVar70);
  auVar70 = vpmulld_avx2(auVar71,auVar73);
  auVar73 = vpmulld_avx2(auVar72,auVar106);
  auVar70 = vpaddd_avx2(auVar70,auVar85);
  auVar99 = vpsubd_avx2(auVar70,auVar73);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x19c);
  auVar72._4_4_ = uVar2;
  auVar72._0_4_ = uVar2;
  auVar72._8_4_ = uVar2;
  auVar72._12_4_ = uVar2;
  auVar72._16_4_ = uVar2;
  auVar72._20_4_ = uVar2;
  auVar72._24_4_ = uVar2;
  auVar72._28_4_ = uVar2;
  auVar70 = vpmulld_avx2(auVar72,auVar10);
  auVar70 = vpaddd_avx2(auVar70,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x224);
  auVar107._4_4_ = uVar2;
  auVar107._0_4_ = uVar2;
  auVar107._8_4_ = uVar2;
  auVar107._12_4_ = uVar2;
  auVar107._16_4_ = uVar2;
  auVar107._20_4_ = uVar2;
  auVar107._24_4_ = uVar2;
  auVar107._28_4_ = uVar2;
  auVar73 = vpmulld_avx2(auVar107,auVar25);
  auVar70 = vpaddd_avx2(auVar70,auVar73);
  auVar25 = vpmulld_avx2(auVar72,auVar25);
  auVar73 = vpmulld_avx2(auVar10,auVar107);
  auVar10 = vpaddd_avx2(auVar25,auVar85);
  auVar72 = vpsubd_avx2(auVar10,auVar73);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x23c);
  auVar73._4_4_ = uVar2;
  auVar73._0_4_ = uVar2;
  auVar73._8_4_ = uVar2;
  auVar73._12_4_ = uVar2;
  auVar73._16_4_ = uVar2;
  auVar73._20_4_ = uVar2;
  auVar73._24_4_ = uVar2;
  auVar73._28_4_ = uVar2;
  auVar10 = vpmulld_avx2(auVar73,auVar11);
  auVar10 = vpaddd_avx2(auVar10,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x184);
  auVar108._4_4_ = uVar2;
  auVar108._0_4_ = uVar2;
  auVar108._8_4_ = uVar2;
  auVar108._12_4_ = uVar2;
  auVar108._16_4_ = uVar2;
  auVar108._20_4_ = uVar2;
  auVar108._24_4_ = uVar2;
  auVar108._28_4_ = uVar2;
  auVar25 = vpmulld_avx2(auVar108,auVar74);
  auVar10 = vpaddd_avx2(auVar10,auVar25);
  auVar25 = vpmulld_avx2(auVar73,auVar74);
  auVar74 = vpmulld_avx2(auVar11,auVar108);
  auVar11 = vpaddd_avx2(auVar25,auVar85);
  auVar86 = vpsubd_avx2(auVar11,auVar74);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1bc);
  auVar74._4_4_ = uVar2;
  auVar74._0_4_ = uVar2;
  auVar74._8_4_ = uVar2;
  auVar74._12_4_ = uVar2;
  auVar74._16_4_ = uVar2;
  auVar74._20_4_ = uVar2;
  auVar74._24_4_ = uVar2;
  auVar74._28_4_ = uVar2;
  auVar11 = vpmulld_avx2(auVar74,auVar75);
  auVar11 = vpaddd_avx2(auVar11,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x204);
  auVar109._4_4_ = uVar2;
  auVar109._0_4_ = uVar2;
  auVar109._8_4_ = uVar2;
  auVar109._12_4_ = uVar2;
  auVar109._16_4_ = uVar2;
  auVar109._20_4_ = uVar2;
  auVar109._24_4_ = uVar2;
  auVar109._28_4_ = uVar2;
  auVar25 = vpmulld_avx2(auVar109,auVar123);
  auVar11 = vpaddd_avx2(auVar11,auVar25);
  auVar25 = vpmulld_avx2(auVar74,auVar123);
  auVar74 = vpmulld_avx2(auVar75,auVar109);
  auVar25 = vpaddd_avx2(auVar25,auVar85);
  auVar123 = vpsubd_avx2(auVar25,auVar74);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1fc);
  auVar75._4_4_ = uVar2;
  auVar75._0_4_ = uVar2;
  auVar75._8_4_ = uVar2;
  auVar75._12_4_ = uVar2;
  auVar75._16_4_ = uVar2;
  auVar75._20_4_ = uVar2;
  auVar75._24_4_ = uVar2;
  auVar75._28_4_ = uVar2;
  auVar25 = vpmulld_avx2(auVar75,auVar67);
  auVar25 = vpaddd_avx2(auVar25,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1c4);
  auVar110._4_4_ = uVar2;
  auVar110._0_4_ = uVar2;
  auVar110._8_4_ = uVar2;
  auVar110._12_4_ = uVar2;
  auVar110._16_4_ = uVar2;
  auVar110._20_4_ = uVar2;
  auVar110._24_4_ = uVar2;
  auVar110._28_4_ = uVar2;
  auVar74 = vpmulld_avx2(auVar110,auVar76);
  auVar25 = vpaddd_avx2(auVar25,auVar74);
  auVar74 = vpmulld_avx2(auVar75,auVar76);
  auVar73 = vpmulld_avx2(auVar67,auVar110);
  auVar74 = vpaddd_avx2(auVar74,auVar85);
  auVar75 = vpsubd_avx2(auVar74,auVar73);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x17c);
  auVar76._4_4_ = uVar2;
  auVar76._0_4_ = uVar2;
  auVar76._8_4_ = uVar2;
  auVar76._12_4_ = uVar2;
  auVar76._16_4_ = uVar2;
  auVar76._20_4_ = uVar2;
  auVar76._24_4_ = uVar2;
  auVar76._28_4_ = uVar2;
  auVar74 = vpmulld_avx2(auVar76,auVar13);
  auVar74 = vpaddd_avx2(auVar74,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x244);
  auVar111._4_4_ = uVar2;
  auVar111._0_4_ = uVar2;
  auVar111._8_4_ = uVar2;
  auVar111._12_4_ = uVar2;
  auVar111._16_4_ = uVar2;
  auVar111._20_4_ = uVar2;
  auVar111._24_4_ = uVar2;
  auVar111._28_4_ = uVar2;
  auVar73 = vpmulld_avx2(auVar111,auVar15);
  auVar74 = vpaddd_avx2(auVar74,auVar73);
  auVar15 = vpmulld_avx2(auVar76,auVar15);
  auVar73 = vpmulld_avx2(auVar13,auVar111);
  auVar13 = vpaddd_avx2(auVar15,auVar85);
  auVar76 = vpsubd_avx2(auVar13,auVar73);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x24c);
  auVar77._4_4_ = uVar2;
  auVar77._0_4_ = uVar2;
  auVar77._8_4_ = uVar2;
  auVar77._12_4_ = uVar2;
  auVar77._16_4_ = uVar2;
  auVar77._20_4_ = uVar2;
  auVar77._24_4_ = uVar2;
  auVar77._28_4_ = uVar2;
  auVar13 = vpmulld_avx2(auVar77,auVar14);
  auVar13 = vpaddd_avx2(auVar13,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x174);
  auVar112._4_4_ = uVar2;
  auVar112._0_4_ = uVar2;
  auVar112._8_4_ = uVar2;
  auVar112._12_4_ = uVar2;
  auVar112._16_4_ = uVar2;
  auVar112._20_4_ = uVar2;
  auVar112._24_4_ = uVar2;
  auVar112._28_4_ = uVar2;
  auVar15 = vpmulld_avx2(auVar112,auVar78);
  auVar13 = vpaddd_avx2(auVar13,auVar15);
  auVar15 = vpmulld_avx2(auVar77,auVar78);
  auVar78 = vpmulld_avx2(auVar14,auVar112);
  auVar14 = vpaddd_avx2(auVar15,auVar85);
  auVar77 = vpsubd_avx2(auVar14,auVar78);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1cc);
  auVar78._4_4_ = uVar2;
  auVar78._0_4_ = uVar2;
  auVar78._8_4_ = uVar2;
  auVar78._12_4_ = uVar2;
  auVar78._16_4_ = uVar2;
  auVar78._20_4_ = uVar2;
  auVar78._24_4_ = uVar2;
  auVar78._28_4_ = uVar2;
  auVar14 = vpmulld_avx2(auVar78,auVar79);
  auVar14 = vpaddd_avx2(auVar14,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 500);
  auVar113._4_4_ = uVar2;
  auVar113._0_4_ = uVar2;
  auVar113._8_4_ = uVar2;
  auVar113._12_4_ = uVar2;
  auVar113._16_4_ = uVar2;
  auVar113._20_4_ = uVar2;
  auVar113._24_4_ = uVar2;
  auVar113._28_4_ = uVar2;
  auVar15 = vpmulld_avx2(auVar113,auVar124);
  auVar14 = vpaddd_avx2(auVar14,auVar15);
  auVar15 = vpmulld_avx2(auVar78,auVar124);
  auVar78 = vpmulld_avx2(auVar79,auVar113);
  auVar15 = vpaddd_avx2(auVar15,auVar85);
  auVar124 = vpsubd_avx2(auVar15,auVar78);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x20c);
  auVar79._4_4_ = uVar2;
  auVar79._0_4_ = uVar2;
  auVar79._8_4_ = uVar2;
  auVar79._12_4_ = uVar2;
  auVar79._16_4_ = uVar2;
  auVar79._20_4_ = uVar2;
  auVar79._24_4_ = uVar2;
  auVar79._28_4_ = uVar2;
  auVar15 = vpmulld_avx2(auVar79,auVar80);
  auVar15 = vpaddd_avx2(auVar15,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1b4);
  auVar114._4_4_ = uVar2;
  auVar114._0_4_ = uVar2;
  auVar114._8_4_ = uVar2;
  auVar114._12_4_ = uVar2;
  auVar114._16_4_ = uVar2;
  auVar114._20_4_ = uVar2;
  auVar114._24_4_ = uVar2;
  auVar114._28_4_ = uVar2;
  auVar78 = vpmulld_avx2(auVar114,auVar53);
  auVar15 = vpaddd_avx2(auVar15,auVar78);
  auVar78 = vpmulld_avx2(auVar79,auVar53);
  auVar73 = vpmulld_avx2(auVar80,auVar114);
  auVar78 = vpaddd_avx2(auVar78,auVar85);
  auVar53 = vpsubd_avx2(auVar78,auVar73);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x18c);
  auVar80._4_4_ = uVar2;
  auVar80._0_4_ = uVar2;
  auVar80._8_4_ = uVar2;
  auVar80._12_4_ = uVar2;
  auVar80._16_4_ = uVar2;
  auVar80._20_4_ = uVar2;
  auVar80._24_4_ = uVar2;
  auVar80._28_4_ = uVar2;
  auVar78 = vpmulld_avx2(auVar80,auVar20);
  auVar78 = vpaddd_avx2(auVar78,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x234);
  auVar115._4_4_ = uVar2;
  auVar115._0_4_ = uVar2;
  auVar115._8_4_ = uVar2;
  auVar115._12_4_ = uVar2;
  auVar115._16_4_ = uVar2;
  auVar115._20_4_ = uVar2;
  auVar115._24_4_ = uVar2;
  auVar115._28_4_ = uVar2;
  auVar73 = vpmulld_avx2(auVar115,auVar82);
  auVar78 = vpaddd_avx2(auVar78,auVar73);
  auVar82 = vpmulld_avx2(auVar80,auVar82);
  auVar73 = vpmulld_avx2(auVar20,auVar115);
  auVar20 = vpaddd_avx2(auVar82,auVar85);
  auVar79 = vpsubd_avx2(auVar20,auVar73);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x22c);
  auVar81._4_4_ = uVar2;
  auVar81._0_4_ = uVar2;
  auVar81._8_4_ = uVar2;
  auVar81._12_4_ = uVar2;
  auVar81._16_4_ = uVar2;
  auVar81._20_4_ = uVar2;
  auVar81._24_4_ = uVar2;
  auVar81._28_4_ = uVar2;
  auVar20 = vpmulld_avx2(auVar81,auVar26);
  auVar20 = vpaddd_avx2(auVar20,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x194);
  auVar116._4_4_ = uVar2;
  auVar116._0_4_ = uVar2;
  auVar116._8_4_ = uVar2;
  auVar116._12_4_ = uVar2;
  auVar116._16_4_ = uVar2;
  auVar116._20_4_ = uVar2;
  auVar116._24_4_ = uVar2;
  auVar116._28_4_ = uVar2;
  auVar82 = vpmulld_avx2(auVar116,auVar21);
  auVar20 = vpaddd_avx2(auVar20,auVar82);
  auVar21 = vpmulld_avx2(auVar81,auVar21);
  auVar26 = vpmulld_avx2(auVar26,auVar116);
  auVar21 = vpaddd_avx2(auVar21,auVar85);
  auVar80 = vpsubd_avx2(auVar21,auVar26);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1ac);
  auVar82._4_4_ = uVar2;
  auVar82._0_4_ = uVar2;
  auVar82._8_4_ = uVar2;
  auVar82._12_4_ = uVar2;
  auVar82._16_4_ = uVar2;
  auVar82._20_4_ = uVar2;
  auVar82._24_4_ = uVar2;
  auVar82._28_4_ = uVar2;
  auVar21 = vpmulld_avx2(auVar82,auVar83);
  auVar21 = vpaddd_avx2(auVar21,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x214);
  auVar117._4_4_ = uVar2;
  auVar117._0_4_ = uVar2;
  auVar117._8_4_ = uVar2;
  auVar117._12_4_ = uVar2;
  auVar117._16_4_ = uVar2;
  auVar117._20_4_ = uVar2;
  auVar117._24_4_ = uVar2;
  auVar117._28_4_ = uVar2;
  auVar26 = vpmulld_avx2(auVar117,auVar52);
  auVar21 = vpaddd_avx2(auVar21,auVar26);
  auVar26 = vpmulld_avx2(auVar82,auVar52);
  auVar82 = vpmulld_avx2(auVar83,auVar117);
  auVar26 = vpaddd_avx2(auVar26,auVar85);
  auVar52 = vpsubd_avx2(auVar26,auVar82);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1ec);
  auVar83._4_4_ = uVar2;
  auVar83._0_4_ = uVar2;
  auVar83._8_4_ = uVar2;
  auVar83._12_4_ = uVar2;
  auVar83._16_4_ = uVar2;
  auVar83._20_4_ = uVar2;
  auVar83._24_4_ = uVar2;
  auVar83._28_4_ = uVar2;
  auVar26 = vpmulld_avx2(auVar83,auVar68);
  auVar26 = vpaddd_avx2(auVar26,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1d4);
  auVar118._4_4_ = uVar2;
  auVar118._0_4_ = uVar2;
  auVar118._8_4_ = uVar2;
  auVar118._12_4_ = uVar2;
  auVar118._16_4_ = uVar2;
  auVar118._20_4_ = uVar2;
  auVar118._24_4_ = uVar2;
  auVar118._28_4_ = uVar2;
  auVar82 = vpmulld_avx2(auVar118,auVar54);
  auVar26 = vpaddd_avx2(auVar26,auVar82);
  auVar82 = vpmulld_avx2(auVar83,auVar54);
  auVar73 = vpmulld_avx2(auVar68,auVar118);
  auVar82 = vpaddd_avx2(auVar82,auVar85);
  auVar54 = vpsubd_avx2(auVar82,auVar73);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x16c);
  auVar84._4_4_ = uVar2;
  auVar84._0_4_ = uVar2;
  auVar84._8_4_ = uVar2;
  auVar84._12_4_ = uVar2;
  auVar84._16_4_ = uVar2;
  auVar84._20_4_ = uVar2;
  auVar84._24_4_ = uVar2;
  auVar84._28_4_ = uVar2;
  auVar82 = vpmulld_avx2(auVar84,auVar16);
  auVar82 = vpaddd_avx2(auVar82,auVar85);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x254);
  auVar119._4_4_ = uVar2;
  auVar119._0_4_ = uVar2;
  auVar119._8_4_ = uVar2;
  auVar119._12_4_ = uVar2;
  auVar119._16_4_ = uVar2;
  auVar119._20_4_ = uVar2;
  auVar119._24_4_ = uVar2;
  auVar119._28_4_ = uVar2;
  auVar73 = vpmulld_avx2(auVar119,auVar18);
  auVar82 = vpaddd_avx2(auVar82,auVar73);
  auVar73 = vpmulld_avx2(auVar84,auVar18);
  auVar67 = vpmulld_avx2(auVar16,auVar119);
  auVar16 = vpaddd_avx2(auVar85,auVar44);
  auVar18 = vpaddd_avx2(auVar85,auVar45);
  auVar73 = vpaddd_avx2(auVar73,auVar85);
  auVar81 = vpsubd_avx2(auVar73,auVar67);
  alVar29 = (__m256i)vpsrad_avx2(auVar16,auVar65);
  auVar16 = vpsrad_avx2(auVar18,auVar65);
  auVar3 = vpsrad_avx2(auVar3,auVar65);
  auVar18 = vpsrad_avx2(auVar27,auVar65);
  auVar19 = vpsrad_avx2(auVar19,auVar65);
  auVar7 = vpsrad_avx2(auVar7,auVar65);
  auVar24 = vpsrad_avx2(auVar24,auVar65);
  auVar27 = vpsrad_avx2(auVar137,auVar65);
  auVar137 = vpsrad_avx2(auVar43,auVar65);
  auVar43 = vpsrad_avx2(auVar51,auVar65);
  auVar8 = vpsrad_avx2(auVar8,auVar65);
  auVar73 = vpsrad_avx2(auVar47,auVar65);
  auVar66 = vpsrad_avx2(auVar66,auVar65);
  auVar67 = vpsrad_avx2(auVar46,auVar65);
  auVar87 = vpsrad_avx2(auVar87,auVar65);
  auVar83 = vpsrad_avx2(auVar102,auVar65);
  alVar30 = (__m256i)vpsrad_avx2(auVar22,auVar65);
  alVar31 = (__m256i)vpsrad_avx2(auVar88,auVar65);
  auVar4 = vpsrad_avx2(auVar4,auVar65);
  auVar22 = vpsrad_avx2(auVar49,auVar65);
  auVar12 = vpsrad_avx2(auVar12,auVar65);
  auVar68 = vpsrad_avx2(auVar93,auVar65);
  auVar92 = vpsrad_avx2(auVar92,auVar65);
  auVar44 = vpsrad_avx2(auVar94,auVar65);
  auVar5 = vpsrad_avx2(auVar5,auVar65);
  auVar45 = vpsrad_avx2(auVar89,auVar65);
  auVar6 = vpsrad_avx2(auVar6,auVar65);
  auVar71 = vpsrad_avx2(auVar48,auVar65);
  auVar65 = ZEXT416(uVar55);
  auVar17 = vpsrad_avx2(auVar17,auVar65);
  auVar46 = vpsrad_avx2(auVar97,auVar65);
  auVar96 = vpsrad_avx2(auVar96,auVar65);
  auVar47 = vpsrad_avx2(auVar98,auVar65);
  alVar32 = (__m256i)vpsrad_avx2(auVar28,auVar65);
  alVar33 = (__m256i)vpsrad_avx2(auVar69,auVar65);
  auVar9 = vpsrad_avx2(auVar9,auVar65);
  auVar28 = vpsrad_avx2(auVar50,auVar65);
  auVar23 = vpsrad_avx2(auVar23,auVar65);
  auVar48 = vpsrad_avx2(auVar99,auVar65);
  auVar70 = vpsrad_avx2(auVar70,auVar65);
  auVar49 = vpsrad_avx2(auVar72,auVar65);
  auVar10 = vpsrad_avx2(auVar10,auVar65);
  auVar97 = vpsrad_avx2(auVar86,auVar65);
  auVar11 = vpsrad_avx2(auVar11,auVar65);
  auVar50 = vpsrad_avx2(auVar123,auVar65);
  auVar25 = vpsrad_avx2(auVar25,auVar65);
  auVar98 = vpsrad_avx2(auVar75,auVar65);
  alVar34 = (__m256i)vpsrad_avx2(auVar74,auVar65);
  auVar74 = vpsrad_avx2(auVar76,auVar65);
  alVar35 = (__m256i)vpsrad_avx2(auVar13,auVar65);
  alVar36 = (__m256i)vpsrad_avx2(auVar77,auVar65);
  auVar13 = vpsrad_avx2(auVar14,auVar65);
  auVar14 = vpsrad_avx2(auVar124,auVar65);
  auVar15 = vpsrad_avx2(auVar15,auVar65);
  auVar123 = vpsrad_avx2(auVar53,auVar65);
  auVar78 = vpsrad_avx2(auVar78,auVar65);
  auVar51 = vpsrad_avx2(auVar79,auVar65);
  auVar20 = vpsrad_avx2(auVar20,auVar65);
  auVar69 = vpsrad_avx2(auVar80,auVar65);
  alVar37 = (__m256i)vpsrad_avx2(auVar21,auVar65);
  alVar38 = (__m256i)vpsrad_avx2(auVar52,auVar65);
  alVar39 = (__m256i)vpsrad_avx2(auVar26,auVar65);
  alVar40 = (__m256i)vpsrad_avx2(auVar54,auVar65);
  alVar41 = (__m256i)vpsrad_avx2(auVar82,auVar65);
  alVar42 = (__m256i)vpsrad_avx2(auVar81,auVar65);
  *output = alVar29;
  output[(uint)(instride * 0x3f)] = alVar33;
  output[(uint)instride] = alVar32;
  output[(uint)(instride * 0x3e)] = alVar31;
  output[(uint)(instride * 2)] = alVar30;
  output[(uint)(instride * 0x3d)] = alVar41;
  output[(uint)(instride * 3)] = alVar42;
  local_1b8 = auVar43._0_8_;
  lStack_1b0 = auVar43._8_8_;
  lStack_1a8 = auVar43._16_8_;
  lStack_1a0 = auVar43._24_8_;
  palVar1 = output + (uint)(instride * 0x3c);
  (*palVar1)[0] = local_1b8;
  (*palVar1)[1] = lStack_1b0;
  (*palVar1)[2] = lStack_1a8;
  (*palVar1)[3] = lStack_1a0;
  local_2d8 = auVar137._0_8_;
  lStack_2d0 = auVar137._8_8_;
  lStack_2c8 = auVar137._16_8_;
  lStack_2c0 = auVar137._24_8_;
  palVar1 = output + (uint)(instride * 4);
  (*palVar1)[0] = local_2d8;
  (*palVar1)[1] = lStack_2d0;
  (*palVar1)[2] = lStack_2c8;
  (*palVar1)[3] = lStack_2c0;
  output[(uint)(instride * 0x3b)] = alVar36;
  output[(uint)(instride * 5)] = alVar35;
  local_818 = auVar96._0_8_;
  lStack_810 = auVar96._8_8_;
  lStack_808 = auVar96._16_8_;
  lStack_800 = auVar96._24_8_;
  palVar1 = output + (uint)(instride * 0x3a);
  (*palVar1)[0] = local_818;
  (*palVar1)[1] = lStack_810;
  (*palVar1)[2] = lStack_808;
  (*palVar1)[3] = lStack_800;
  local_698 = auVar47._0_8_;
  lStack_690 = auVar47._8_8_;
  lStack_688 = auVar47._16_8_;
  lStack_680 = auVar47._24_8_;
  palVar1 = output + (uint)(instride * 6);
  (*palVar1)[0] = local_698;
  (*palVar1)[1] = lStack_690;
  (*palVar1)[2] = lStack_688;
  (*palVar1)[3] = lStack_680;
  output[(uint)(instride * 0x39)] = alVar34;
  local_6b8 = auVar74._0_8_;
  lStack_6b0 = auVar74._8_8_;
  lStack_6a8 = auVar74._16_8_;
  lStack_6a0 = auVar74._24_8_;
  palVar1 = output + (uint)(instride * 7);
  (*palVar1)[0] = local_6b8;
  (*palVar1)[1] = lStack_6b0;
  (*palVar1)[2] = lStack_6a8;
  (*palVar1)[3] = lStack_6a0;
  local_878 = auVar7._0_8_;
  lStack_870 = auVar7._8_8_;
  lStack_868 = auVar7._16_8_;
  lStack_860 = auVar7._24_8_;
  palVar1 = output + (uint)(instride * 0x38);
  (*palVar1)[0] = local_878;
  (*palVar1)[1] = lStack_870;
  (*palVar1)[2] = lStack_868;
  (*palVar1)[3] = lStack_860;
  local_858 = auVar19._0_8_;
  lStack_850 = auVar19._8_8_;
  lStack_848 = auVar19._16_8_;
  lStack_840 = auVar19._24_8_;
  palVar1 = output + (uint)(instride * 8);
  (*palVar1)[0] = local_858;
  (*palVar1)[1] = lStack_850;
  (*palVar1)[2] = lStack_848;
  (*palVar1)[3] = lStack_840;
  local_7f8 = auVar97._0_8_;
  lStack_7f0 = auVar97._8_8_;
  lStack_7e8 = auVar97._16_8_;
  lStack_7e0 = auVar97._24_8_;
  palVar1 = output + (uint)(instride * 0x37);
  (*palVar1)[0] = local_7f8;
  (*palVar1)[1] = lStack_7f0;
  (*palVar1)[2] = lStack_7e8;
  (*palVar1)[3] = lStack_7e0;
  local_598 = auVar10._0_8_;
  lStack_590 = auVar10._8_8_;
  lStack_588 = auVar10._16_8_;
  lStack_580 = auVar10._24_8_;
  palVar1 = output + (uint)(instride * 9);
  (*palVar1)[0] = local_598;
  (*palVar1)[1] = lStack_590;
  (*palVar1)[2] = lStack_588;
  (*palVar1)[3] = lStack_580;
  local_538 = auVar45._0_8_;
  lStack_530 = auVar45._8_8_;
  lStack_528 = auVar45._16_8_;
  lStack_520 = auVar45._24_8_;
  palVar1 = output + (uint)(instride * 0x36);
  (*palVar1)[0] = local_538;
  (*palVar1)[1] = lStack_530;
  (*palVar1)[2] = lStack_528;
  (*palVar1)[3] = lStack_520;
  local_2b8 = auVar5._0_8_;
  lStack_2b0 = auVar5._8_8_;
  lStack_2a8 = auVar5._16_8_;
  lStack_2a0 = auVar5._24_8_;
  palVar1 = output + (uint)(instride * 10);
  (*palVar1)[0] = local_2b8;
  (*palVar1)[1] = lStack_2b0;
  (*palVar1)[2] = lStack_2a8;
  (*palVar1)[3] = lStack_2a0;
  local_578 = auVar78._0_8_;
  lStack_570 = auVar78._8_8_;
  lStack_568 = auVar78._16_8_;
  lStack_560 = auVar78._24_8_;
  palVar1 = output + (uint)(instride * 0x35);
  (*palVar1)[0] = local_578;
  (*palVar1)[1] = lStack_570;
  (*palVar1)[2] = lStack_568;
  (*palVar1)[3] = lStack_560;
  local_558 = auVar51._0_8_;
  lStack_550 = auVar51._8_8_;
  lStack_548 = auVar51._16_8_;
  lStack_540 = auVar51._24_8_;
  palVar1 = output + (uint)(instride * 0xb);
  (*palVar1)[0] = local_558;
  (*palVar1)[1] = lStack_550;
  (*palVar1)[2] = lStack_548;
  (*palVar1)[3] = lStack_540;
  local_838 = auVar87._0_8_;
  lStack_830 = auVar87._8_8_;
  lStack_828 = auVar87._16_8_;
  lStack_820 = auVar87._24_8_;
  palVar1 = output + (uint)(instride * 0x34);
  (*palVar1)[0] = local_838;
  (*palVar1)[1] = lStack_830;
  (*palVar1)[2] = lStack_828;
  (*palVar1)[3] = lStack_820;
  local_758 = auVar83._0_8_;
  lStack_750 = auVar83._8_8_;
  lStack_748 = auVar83._16_8_;
  lStack_740 = auVar83._24_8_;
  palVar1 = output + (uint)(instride * 0xc);
  (*palVar1)[0] = local_758;
  (*palVar1)[1] = lStack_750;
  (*palVar1)[2] = lStack_748;
  (*palVar1)[3] = lStack_740;
  local_4f8 = auVar69._0_8_;
  lStack_4f0 = auVar69._8_8_;
  lStack_4e8 = auVar69._16_8_;
  lStack_4e0 = auVar69._24_8_;
  palVar1 = output + (uint)(instride * 0x33);
  (*palVar1)[0] = local_4f8;
  (*palVar1)[1] = lStack_4f0;
  (*palVar1)[2] = lStack_4e8;
  (*palVar1)[3] = lStack_4e0;
  local_518 = auVar20._0_8_;
  lStack_510 = auVar20._8_8_;
  lStack_508 = auVar20._16_8_;
  lStack_500 = auVar20._24_8_;
  palVar1 = output + (uint)(instride * 0xd);
  (*palVar1)[0] = local_518;
  (*palVar1)[1] = lStack_510;
  (*palVar1)[2] = lStack_508;
  (*palVar1)[3] = lStack_500;
  local_4d8 = auVar92._0_8_;
  lStack_4d0 = auVar92._8_8_;
  lStack_4c8 = auVar92._16_8_;
  lStack_4c0 = auVar92._24_8_;
  palVar1 = output + (uint)(instride * 0x32);
  (*palVar1)[0] = local_4d8;
  (*palVar1)[1] = lStack_4d0;
  (*palVar1)[2] = lStack_4c8;
  (*palVar1)[3] = lStack_4c0;
  local_298 = auVar44._0_8_;
  lStack_290 = auVar44._8_8_;
  lStack_288 = auVar44._16_8_;
  lStack_280 = auVar44._24_8_;
  palVar1 = output + (uint)(instride * 0xe);
  (*palVar1)[0] = local_298;
  (*palVar1)[1] = lStack_290;
  (*palVar1)[2] = lStack_288;
  (*palVar1)[3] = lStack_280;
  local_4b8 = auVar70._0_8_;
  lStack_4b0 = auVar70._8_8_;
  lStack_4a8 = auVar70._16_8_;
  lStack_4a0 = auVar70._24_8_;
  palVar1 = output + (uint)(instride * 0x31);
  (*palVar1)[0] = local_4b8;
  (*palVar1)[1] = lStack_4b0;
  (*palVar1)[2] = lStack_4a8;
  (*palVar1)[3] = lStack_4a0;
  local_498 = auVar49._0_8_;
  lStack_490 = auVar49._8_8_;
  lStack_488 = auVar49._16_8_;
  lStack_480 = auVar49._24_8_;
  palVar1 = output + (uint)(instride * 0xf);
  (*palVar1)[0] = local_498;
  (*palVar1)[1] = lStack_490;
  (*palVar1)[2] = lStack_488;
  (*palVar1)[3] = lStack_480;
  local_678 = auVar18._0_8_;
  lStack_670 = auVar18._8_8_;
  lStack_668 = auVar18._16_8_;
  lStack_660 = auVar18._24_8_;
  palVar1 = output + (uint)(instride * 0x30);
  (*palVar1)[0] = local_678;
  (*palVar1)[1] = lStack_670;
  (*palVar1)[2] = lStack_668;
  (*palVar1)[3] = lStack_660;
  local_3f8 = auVar3._0_8_;
  lStack_3f0 = auVar3._8_8_;
  lStack_3e8 = auVar3._16_8_;
  lStack_3e0 = auVar3._24_8_;
  palVar1 = output + (uint)(instride << 4);
  (*palVar1)[0] = local_3f8;
  (*palVar1)[1] = lStack_3f0;
  (*palVar1)[2] = lStack_3e8;
  (*palVar1)[3] = lStack_3e0;
  local_478 = auVar48._0_8_;
  lStack_470 = auVar48._8_8_;
  lStack_468 = auVar48._16_8_;
  lStack_460 = auVar48._24_8_;
  palVar1 = output + (uint)(instride * 0x2f);
  (*palVar1)[0] = local_478;
  (*palVar1)[1] = lStack_470;
  (*palVar1)[2] = lStack_468;
  (*palVar1)[3] = lStack_460;
  local_458 = auVar23._0_8_;
  lStack_450 = auVar23._8_8_;
  lStack_448 = auVar23._16_8_;
  lStack_440 = auVar23._24_8_;
  palVar1 = output + (uint)(instride * 0x11);
  (*palVar1)[0] = local_458;
  (*palVar1)[1] = lStack_450;
  (*palVar1)[2] = lStack_448;
  (*palVar1)[3] = lStack_440;
  local_438 = auVar68._0_8_;
  lStack_430 = auVar68._8_8_;
  lStack_428 = auVar68._16_8_;
  lStack_420 = auVar68._24_8_;
  palVar1 = output + (uint)(instride * 0x2e);
  (*palVar1)[0] = local_438;
  (*palVar1)[1] = lStack_430;
  (*palVar1)[2] = lStack_428;
  (*palVar1)[3] = lStack_420;
  local_3d8 = auVar12._0_8_;
  lStack_3d0 = auVar12._8_8_;
  lStack_3c8 = auVar12._16_8_;
  lStack_3c0 = auVar12._24_8_;
  palVar1 = output + (uint)(instride * 0x12);
  (*palVar1)[0] = local_3d8;
  (*palVar1)[1] = lStack_3d0;
  (*palVar1)[2] = lStack_3c8;
  (*palVar1)[3] = lStack_3c0;
  output[(uint)(instride * 0x2d)] = alVar37;
  output[(uint)(instride * 0x13)] = alVar38;
  local_638 = auVar67._0_8_;
  lStack_630 = auVar67._8_8_;
  lStack_628 = auVar67._16_8_;
  lStack_620 = auVar67._24_8_;
  palVar1 = output + (uint)(instride * 0x2c);
  (*palVar1)[0] = local_638;
  (*palVar1)[1] = lStack_630;
  (*palVar1)[2] = lStack_628;
  (*palVar1)[3] = lStack_620;
  local_398 = auVar66._0_8_;
  lStack_390 = auVar66._8_8_;
  lStack_388 = auVar66._16_8_;
  lStack_380 = auVar66._24_8_;
  palVar1 = output + (uint)(instride * 0x14);
  (*palVar1)[0] = local_398;
  (*palVar1)[1] = lStack_390;
  (*palVar1)[2] = lStack_388;
  (*palVar1)[3] = lStack_380;
  local_658 = auVar123._0_8_;
  lStack_650 = auVar123._8_8_;
  lStack_648 = auVar123._16_8_;
  lStack_640 = auVar123._24_8_;
  palVar1 = output + (uint)(instride * 0x2b);
  (*palVar1)[0] = local_658;
  (*palVar1)[1] = lStack_650;
  (*palVar1)[2] = lStack_648;
  (*palVar1)[3] = lStack_640;
  local_418 = auVar15._0_8_;
  lStack_410 = auVar15._8_8_;
  lStack_408 = auVar15._16_8_;
  lStack_400 = auVar15._24_8_;
  palVar1 = output + (uint)(instride * 0x15);
  (*palVar1)[0] = local_418;
  (*palVar1)[1] = lStack_410;
  (*palVar1)[2] = lStack_408;
  (*palVar1)[3] = lStack_400;
  local_258 = auVar6._0_8_;
  lStack_250 = auVar6._8_8_;
  lStack_248 = auVar6._16_8_;
  lStack_240 = auVar6._24_8_;
  palVar1 = output + (uint)(instride * 0x2a);
  (*palVar1)[0] = local_258;
  (*palVar1)[1] = lStack_250;
  (*palVar1)[2] = lStack_248;
  (*palVar1)[3] = lStack_240;
  local_238 = auVar71._0_8_;
  lStack_230 = auVar71._8_8_;
  lStack_228 = auVar71._16_8_;
  lStack_220 = auVar71._24_8_;
  palVar1 = output + (uint)(instride * 0x16);
  (*palVar1)[0] = local_238;
  (*palVar1)[1] = lStack_230;
  (*palVar1)[2] = lStack_228;
  (*palVar1)[3] = lStack_220;
  local_3b8 = auVar11._0_8_;
  lStack_3b0 = auVar11._8_8_;
  lStack_3a8 = auVar11._16_8_;
  lStack_3a0 = auVar11._24_8_;
  palVar1 = output + (uint)(instride * 0x29);
  (*palVar1)[0] = local_3b8;
  (*palVar1)[1] = lStack_3b0;
  (*palVar1)[2] = lStack_3a8;
  (*palVar1)[3] = lStack_3a0;
  local_278 = auVar50._0_8_;
  lStack_270 = auVar50._8_8_;
  lStack_268 = auVar50._16_8_;
  lStack_260 = auVar50._24_8_;
  palVar1 = output + (uint)(instride * 0x17);
  (*palVar1)[0] = local_278;
  (*palVar1)[1] = lStack_270;
  (*palVar1)[2] = lStack_268;
  (*palVar1)[3] = lStack_260;
  local_378 = auVar24._0_8_;
  lStack_370 = auVar24._8_8_;
  lStack_368 = auVar24._16_8_;
  lStack_360 = auVar24._24_8_;
  palVar1 = output + (uint)(instride * 0x28);
  (*palVar1)[0] = local_378;
  (*palVar1)[1] = lStack_370;
  (*palVar1)[2] = lStack_368;
  (*palVar1)[3] = lStack_360;
  local_358 = auVar27._0_8_;
  lStack_350 = auVar27._8_8_;
  lStack_348 = auVar27._16_8_;
  lStack_340 = auVar27._24_8_;
  palVar1 = output + (uint)(instride * 0x18);
  (*palVar1)[0] = local_358;
  (*palVar1)[1] = lStack_350;
  (*palVar1)[2] = lStack_348;
  (*palVar1)[3] = lStack_340;
  local_218 = auVar98._0_8_;
  lStack_210 = auVar98._8_8_;
  lStack_208 = auVar98._16_8_;
  lStack_200 = auVar98._24_8_;
  palVar1 = output + (uint)(instride * 0x27);
  (*palVar1)[0] = local_218;
  (*palVar1)[1] = lStack_210;
  (*palVar1)[2] = lStack_208;
  (*palVar1)[3] = lStack_200;
  local_1f8 = auVar25._0_8_;
  lStack_1f0 = auVar25._8_8_;
  lStack_1e8 = auVar25._16_8_;
  lStack_1e0 = auVar25._24_8_;
  palVar1 = output + (uint)(instride * 0x19);
  (*palVar1)[0] = local_1f8;
  (*palVar1)[1] = lStack_1f0;
  (*palVar1)[2] = lStack_1e8;
  (*palVar1)[3] = lStack_1e0;
  local_318 = auVar46._0_8_;
  lStack_310 = auVar46._8_8_;
  lStack_308 = auVar46._16_8_;
  lStack_300 = auVar46._24_8_;
  palVar1 = output + (uint)(instride * 0x26);
  (*palVar1)[0] = local_318;
  (*palVar1)[1] = lStack_310;
  (*palVar1)[2] = lStack_308;
  (*palVar1)[3] = lStack_300;
  local_198 = auVar17._0_8_;
  lStack_190 = auVar17._8_8_;
  lStack_188 = auVar17._16_8_;
  lStack_180 = auVar17._24_8_;
  palVar1 = output + (uint)(instride * 0x1a);
  (*palVar1)[0] = local_198;
  (*palVar1)[1] = lStack_190;
  (*palVar1)[2] = lStack_188;
  (*palVar1)[3] = lStack_180;
  local_1d8 = auVar13._0_8_;
  lStack_1d0 = auVar13._8_8_;
  lStack_1c8 = auVar13._16_8_;
  lStack_1c0 = auVar13._24_8_;
  palVar1 = output + (uint)(instride * 0x25);
  (*palVar1)[0] = local_1d8;
  (*palVar1)[1] = lStack_1d0;
  (*palVar1)[2] = lStack_1c8;
  (*palVar1)[3] = lStack_1c0;
  local_338 = auVar14._0_8_;
  lStack_330 = auVar14._8_8_;
  lStack_328 = auVar14._16_8_;
  lStack_320 = auVar14._24_8_;
  palVar1 = output + (uint)(instride * 0x1b);
  (*palVar1)[0] = local_338;
  (*palVar1)[1] = lStack_330;
  (*palVar1)[2] = lStack_328;
  (*palVar1)[3] = lStack_320;
  local_178 = auVar8._0_8_;
  lStack_170 = auVar8._8_8_;
  lStack_168 = auVar8._16_8_;
  lStack_160 = auVar8._24_8_;
  palVar1 = output + (uint)(instride * 0x24);
  (*palVar1)[0] = local_178;
  (*palVar1)[1] = lStack_170;
  (*palVar1)[2] = lStack_168;
  (*palVar1)[3] = lStack_160;
  local_158 = auVar73._0_8_;
  lStack_150 = auVar73._8_8_;
  lStack_148 = auVar73._16_8_;
  lStack_140 = auVar73._24_8_;
  palVar1 = output + (uint)(instride * 0x1c);
  (*palVar1)[0] = local_158;
  (*palVar1)[1] = lStack_150;
  (*palVar1)[2] = lStack_148;
  (*palVar1)[3] = lStack_140;
  output[(uint)(instride * 0x23)] = alVar40;
  output[(uint)(instride * 0x1d)] = alVar39;
  local_118 = auVar4._0_8_;
  lStack_110 = auVar4._8_8_;
  lStack_108 = auVar4._16_8_;
  lStack_100 = auVar4._24_8_;
  palVar1 = output + (uint)(instride * 0x22);
  (*palVar1)[0] = local_118;
  (*palVar1)[1] = lStack_110;
  (*palVar1)[2] = lStack_108;
  (*palVar1)[3] = lStack_100;
  local_d8 = auVar22._0_8_;
  lStack_d0 = auVar22._8_8_;
  lStack_c8 = auVar22._16_8_;
  lStack_c0 = auVar22._24_8_;
  palVar1 = output + (uint)(instride * 0x1e);
  (*palVar1)[0] = local_d8;
  (*palVar1)[1] = lStack_d0;
  (*palVar1)[2] = lStack_c8;
  (*palVar1)[3] = lStack_c0;
  local_138 = auVar9._0_8_;
  lStack_130 = auVar9._8_8_;
  lStack_128 = auVar9._16_8_;
  lStack_120 = auVar9._24_8_;
  palVar1 = output + (uint)(instride * 0x21);
  (*palVar1)[0] = local_138;
  (*palVar1)[1] = lStack_130;
  (*palVar1)[2] = lStack_128;
  (*palVar1)[3] = lStack_120;
  local_f8 = auVar28._0_8_;
  lStack_f0 = auVar28._8_8_;
  lStack_e8 = auVar28._16_8_;
  lStack_e0 = auVar28._24_8_;
  palVar1 = output + (uint)(instride * 0x1f);
  (*palVar1)[0] = local_f8;
  (*palVar1)[1] = lStack_f0;
  (*palVar1)[2] = lStack_e8;
  (*palVar1)[3] = lStack_e0;
  local_b8 = auVar16._0_8_;
  lStack_b0 = auVar16._8_8_;
  lStack_a8 = auVar16._16_8_;
  lStack_a0 = auVar16._24_8_;
  palVar1 = output + (uint)(instride << 5);
  (*palVar1)[0] = local_b8;
  (*palVar1)[1] = lStack_b0;
  (*palVar1)[2] = lStack_a8;
  (*palVar1)[3] = lStack_a0;
  return;
}

Assistant:

static void fdct64_avx2(__m256i *input, __m256i *output, int8_t cos_bit,
                        const int instride, const int outstride) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i __rounding = _mm256_set1_epi32(1 << (cos_bit - 1));
  __m256i cospi_m32 = _mm256_set1_epi32(-cospi[32]);
  __m256i cospi_p32 = _mm256_set1_epi32(cospi[32]);
  __m256i cospi_m16 = _mm256_set1_epi32(-cospi[16]);
  __m256i cospi_p48 = _mm256_set1_epi32(cospi[48]);
  __m256i cospi_m48 = _mm256_set1_epi32(-cospi[48]);
  __m256i cospi_p16 = _mm256_set1_epi32(cospi[16]);
  __m256i cospi_m08 = _mm256_set1_epi32(-cospi[8]);
  __m256i cospi_p56 = _mm256_set1_epi32(cospi[56]);
  __m256i cospi_m56 = _mm256_set1_epi32(-cospi[56]);
  __m256i cospi_m40 = _mm256_set1_epi32(-cospi[40]);
  __m256i cospi_p24 = _mm256_set1_epi32(cospi[24]);
  __m256i cospi_m24 = _mm256_set1_epi32(-cospi[24]);
  __m256i cospi_p08 = _mm256_set1_epi32(cospi[8]);
  __m256i cospi_p40 = _mm256_set1_epi32(cospi[40]);

  int startidx = 0 * instride;
  int endidx = 63 * instride;
  // stage 1
  __m256i x1[64];
  x1[0] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[63] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[1] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[62] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[2] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[61] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[3] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[60] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[4] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[59] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[5] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[58] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[6] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[57] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[7] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[56] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[8] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[55] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[9] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[54] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[10] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[53] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[11] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[52] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[12] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[51] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[13] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[50] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[14] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[49] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[15] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[48] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[16] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[47] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[17] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[46] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[18] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[45] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[19] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[44] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[20] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[43] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[21] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[42] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[22] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[41] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[23] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[40] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[24] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[39] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[25] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[38] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[26] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[37] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[27] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[36] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[28] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[35] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[29] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[34] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[30] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[33] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[31] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[32] = _mm256_sub_epi32(input[startidx], input[endidx]);

  // stage 2
  __m256i x2[64];
  fdct64_stage2_avx2(x1, x2, &cospi_m32, &cospi_p32, &__rounding, cos_bit);
  // stage 3
  fdct64_stage3_avx2(x2, x1, &cospi_m32, &cospi_p32, &__rounding, cos_bit);
  // stage 4
  fdct64_stage4_avx2(x1, x2, &cospi_m32, &cospi_p32, &cospi_m16, &cospi_p48,
                     &cospi_m48, &__rounding, cos_bit);
  // stage 5
  fdct64_stage5_avx2(x2, x1, &cospi_m32, &cospi_p32, &cospi_m16, &cospi_p48,
                     &cospi_m48, &__rounding, cos_bit);
  // stage 6
  fdct64_stage6_avx2(x1, x2, &cospi_p16, &cospi_p32, &cospi_m16, &cospi_p48,
                     &cospi_m48, &cospi_m08, &cospi_p56, &cospi_m56, &cospi_m40,
                     &cospi_p24, &cospi_m24, &__rounding, cos_bit);
  // stage 7
  fdct64_stage7_avx2(x2, x1, &cospi_p08, &cospi_p56, &cospi_p40, &cospi_p24,
                     &cospi_m08, &cospi_m56, &cospi_m40, &cospi_m24,
                     &__rounding, cos_bit);
  // stage 8
  fdct64_stage8_avx2(x1, x2, cospi, &__rounding, cos_bit);
  // stage 9
  fdct64_stage9_avx2(x2, x1, cospi, &__rounding, cos_bit);
  // stage 10
  fdct64_stage10_avx2(x1, x2, cospi, &__rounding, cos_bit);

  startidx = 0 * outstride;
  endidx = 63 * outstride;

  // stage 11
  output[startidx] = x2[0];
  output[endidx] = x2[63];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[32];
  output[endidx] = x2[31];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[16];
  output[endidx] = x2[47];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[48];
  output[endidx] = x2[15];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[8];
  output[endidx] = x2[55];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[40];
  output[endidx] = x2[23];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[24];
  output[endidx] = x2[39];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[56];
  output[endidx] = x2[7];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[4];
  output[endidx] = x2[59];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[36];
  output[endidx] = x2[27];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[20];
  output[endidx] = x2[43];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[52];
  output[endidx] = x2[11];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[12];
  output[endidx] = x2[51];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[44];
  output[endidx] = x2[19];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[28];
  output[endidx] = x2[35];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[60];
  output[endidx] = x2[3];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[2];
  output[endidx] = x2[61];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[34];
  output[endidx] = x2[29];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[18];
  output[endidx] = x2[45];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[50];
  output[endidx] = x2[13];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[10];
  output[endidx] = x2[53];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[42];
  output[endidx] = x2[21];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[26];
  output[endidx] = x2[37];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[58];
  output[endidx] = x2[5];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[6];
  output[endidx] = x2[57];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[38];
  output[endidx] = x2[25];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[22];
  output[endidx] = x2[41];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[54];
  output[endidx] = x2[9];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[14];
  output[endidx] = x2[49];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[46];
  output[endidx] = x2[17];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[30];
  output[endidx] = x2[33];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[62];
  output[endidx] = x2[1];
}